

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  long lVar4;
  __int_type_conflict _Var5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  uint uVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  long lVar48;
  byte bVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  float fVar53;
  undefined4 uVar54;
  float fVar55;
  float fVar56;
  float fVar79;
  float fVar80;
  vint4 bi_2;
  float fVar81;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar82;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined8 uVar83;
  vint4 bi_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 extraout_var [56];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar115;
  vint4 ai_2;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  float fVar138;
  vint4 ai;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  float fVar152;
  float fVar167;
  float fVar168;
  vfloat4 b0;
  float fVar169;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  float fVar170;
  float fVar183;
  vfloat4 a0_3;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar174 [16];
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar184;
  undefined1 auVar182 [32];
  float fVar188;
  float fVar199;
  vint4 ai_1;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar200;
  float fVar216;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar217;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  __m128 a;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  vfloat4 a0_1;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar240;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar241 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar242 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  vfloat4 a0;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar277 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_648 [8];
  float fStack_640;
  float fStack_63c;
  undefined1 local_628 [8];
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined1 local_548 [32];
  undefined1 local_528 [16];
  undefined1 (*local_510) [16];
  ulong local_508;
  long local_500;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 auStack_4e8 [16];
  undefined1 local_4d8 [32];
  RTCFilterFunctionNArguments local_4b8;
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  uint auStack_3c8 [4];
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 auStack_3a8 [16];
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint local_388;
  uint uStack_384;
  uint uStack_380;
  uint uStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  undefined1 auVar276 [32];
  
  PVar2 = prim[1];
  uVar47 = (ulong)(byte)PVar2;
  fVar53 = *(float *)(prim + uVar47 * 0x19 + 0x12);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar124 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar124 = vinsertps_avx(auVar124,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar101 = vsubps_avx(auVar101,*(undefined1 (*) [16])(prim + uVar47 * 0x19 + 6));
  auVar236._0_4_ = fVar53 * auVar101._0_4_;
  auVar236._4_4_ = fVar53 * auVar101._4_4_;
  auVar236._8_4_ = fVar53 * auVar101._8_4_;
  auVar236._12_4_ = fVar53 * auVar101._12_4_;
  auVar118._0_4_ = fVar53 * auVar124._0_4_;
  auVar118._4_4_ = fVar53 * auVar124._4_4_;
  auVar118._8_4_ = fVar53 * auVar124._8_4_;
  auVar118._12_4_ = fVar53 * auVar124._12_4_;
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 4 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar124 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 5 + 6)));
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 6 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar47 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar47 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar46 = (ulong)(uint)((int)(uVar47 * 9) * 2);
  auVar59 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 + 6)));
  auVar59 = vcvtdq2ps_avx(auVar59);
  auVar58 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 + uVar47 + 6)));
  auVar58 = vcvtdq2ps_avx(auVar58);
  uVar46 = (ulong)(uint)((int)(uVar47 * 5) << 2);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar46 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar265._4_4_ = auVar118._0_4_;
  auVar265._0_4_ = auVar118._0_4_;
  auVar265._8_4_ = auVar118._0_4_;
  auVar265._12_4_ = auVar118._0_4_;
  auVar85 = vshufps_avx(auVar118,auVar118,0x55);
  auVar57 = vshufps_avx(auVar118,auVar118,0xaa);
  fVar53 = auVar57._0_4_;
  auVar233._0_4_ = fVar53 * auVar121._0_4_;
  fVar56 = auVar57._4_4_;
  auVar233._4_4_ = fVar56 * auVar121._4_4_;
  fVar80 = auVar57._8_4_;
  auVar233._8_4_ = fVar80 * auVar121._8_4_;
  fVar81 = auVar57._12_4_;
  auVar233._12_4_ = fVar81 * auVar121._12_4_;
  auVar218._0_4_ = auVar10._0_4_ * fVar53;
  auVar218._4_4_ = auVar10._4_4_ * fVar56;
  auVar218._8_4_ = auVar10._8_4_ * fVar80;
  auVar218._12_4_ = auVar10._12_4_ * fVar81;
  auVar189._0_4_ = auVar106._0_4_ * fVar53;
  auVar189._4_4_ = auVar106._4_4_ * fVar56;
  auVar189._8_4_ = auVar106._8_4_ * fVar80;
  auVar189._12_4_ = auVar106._12_4_ * fVar81;
  auVar57 = vfmadd231ps_fma(auVar233,auVar85,auVar124);
  auVar86 = vfmadd231ps_fma(auVar218,auVar85,auVar9);
  auVar85 = vfmadd231ps_fma(auVar189,auVar58,auVar85);
  auVar116 = vfmadd231ps_fma(auVar57,auVar265,auVar101);
  auVar86 = vfmadd231ps_fma(auVar86,auVar265,auVar8);
  auVar129 = vfmadd231ps_fma(auVar85,auVar59,auVar265);
  auVar266._4_4_ = auVar236._0_4_;
  auVar266._0_4_ = auVar236._0_4_;
  auVar266._8_4_ = auVar236._0_4_;
  auVar266._12_4_ = auVar236._0_4_;
  auVar85 = vshufps_avx(auVar236,auVar236,0x55);
  auVar57 = vshufps_avx(auVar236,auVar236,0xaa);
  fVar53 = auVar57._0_4_;
  auVar139._0_4_ = fVar53 * auVar121._0_4_;
  fVar56 = auVar57._4_4_;
  auVar139._4_4_ = fVar56 * auVar121._4_4_;
  fVar80 = auVar57._8_4_;
  auVar139._8_4_ = fVar80 * auVar121._8_4_;
  fVar81 = auVar57._12_4_;
  auVar139._12_4_ = fVar81 * auVar121._12_4_;
  auVar84._0_4_ = auVar10._0_4_ * fVar53;
  auVar84._4_4_ = auVar10._4_4_ * fVar56;
  auVar84._8_4_ = auVar10._8_4_ * fVar80;
  auVar84._12_4_ = auVar10._12_4_ * fVar81;
  auVar57._0_4_ = auVar106._0_4_ * fVar53;
  auVar57._4_4_ = auVar106._4_4_ * fVar56;
  auVar57._8_4_ = auVar106._8_4_ * fVar80;
  auVar57._12_4_ = auVar106._12_4_ * fVar81;
  auVar124 = vfmadd231ps_fma(auVar139,auVar85,auVar124);
  auVar121 = vfmadd231ps_fma(auVar84,auVar85,auVar9);
  auVar9 = vfmadd231ps_fma(auVar57,auVar85,auVar58);
  auVar10 = vfmadd231ps_fma(auVar124,auVar266,auVar101);
  auVar58 = vfmadd231ps_fma(auVar121,auVar266,auVar8);
  auVar106 = vfmadd231ps_fma(auVar9,auVar266,auVar59);
  local_3f8._8_4_ = 0x7fffffff;
  local_3f8._0_8_ = 0x7fffffff7fffffff;
  local_3f8._12_4_ = 0x7fffffff;
  auVar101 = vandps_avx(auVar116,local_3f8);
  auVar128._8_4_ = 0x219392ef;
  auVar128._0_8_ = 0x219392ef219392ef;
  auVar128._12_4_ = 0x219392ef;
  auVar101 = vcmpps_avx(auVar101,auVar128,1);
  auVar124 = vblendvps_avx(auVar116,auVar128,auVar101);
  auVar101 = vandps_avx(auVar86,local_3f8);
  auVar101 = vcmpps_avx(auVar101,auVar128,1);
  auVar121 = vblendvps_avx(auVar86,auVar128,auVar101);
  auVar101 = vandps_avx(auVar129,local_3f8);
  auVar101 = vcmpps_avx(auVar101,auVar128,1);
  auVar101 = vblendvps_avx(auVar129,auVar128,auVar101);
  auVar8 = vrcpps_avx(auVar124);
  auVar171._8_4_ = 0x3f800000;
  auVar171._0_8_ = 0x3f8000003f800000;
  auVar171._12_4_ = 0x3f800000;
  auVar124 = vfnmadd213ps_fma(auVar124,auVar8,auVar171);
  auVar8 = vfmadd132ps_fma(auVar124,auVar8,auVar8);
  auVar124 = vrcpps_avx(auVar121);
  auVar121 = vfnmadd213ps_fma(auVar121,auVar124,auVar171);
  auVar9 = vfmadd132ps_fma(auVar121,auVar124,auVar124);
  auVar124 = vrcpps_avx(auVar101);
  auVar101 = vfnmadd213ps_fma(auVar101,auVar124,auVar171);
  auVar59 = vfmadd132ps_fma(auVar101,auVar124,auVar124);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar47 * 7 + 6);
  auVar101 = vpmovsxwd_avx(auVar101);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar10);
  auVar129._0_4_ = auVar8._0_4_ * auVar101._0_4_;
  auVar129._4_4_ = auVar8._4_4_ * auVar101._4_4_;
  auVar129._8_4_ = auVar8._8_4_ * auVar101._8_4_;
  auVar129._12_4_ = auVar8._12_4_ * auVar101._12_4_;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *(ulong *)(prim + uVar47 * 9 + 6);
  auVar101 = vpmovsxwd_avx(auVar124);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar10);
  auVar140._0_4_ = auVar8._0_4_ * auVar101._0_4_;
  auVar140._4_4_ = auVar8._4_4_ * auVar101._4_4_;
  auVar140._8_4_ = auVar8._8_4_ * auVar101._8_4_;
  auVar140._12_4_ = auVar8._12_4_ * auVar101._12_4_;
  auVar86._1_3_ = 0;
  auVar86[0] = PVar2;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar124 = vpmovsxwd_avx(auVar121);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar47 * -2 + 6);
  auVar101 = vpmovsxwd_avx(auVar8);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar58);
  auVar190._0_4_ = auVar101._0_4_ * auVar9._0_4_;
  auVar190._4_4_ = auVar101._4_4_ * auVar9._4_4_;
  auVar190._8_4_ = auVar101._8_4_ * auVar9._8_4_;
  auVar190._12_4_ = auVar101._12_4_ * auVar9._12_4_;
  auVar101 = vcvtdq2ps_avx(auVar124);
  auVar101 = vsubps_avx(auVar101,auVar58);
  auVar85._0_4_ = auVar9._0_4_ * auVar101._0_4_;
  auVar85._4_4_ = auVar9._4_4_ * auVar101._4_4_;
  auVar85._8_4_ = auVar9._8_4_ * auVar101._8_4_;
  auVar85._12_4_ = auVar9._12_4_ * auVar101._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar46 + uVar47 + 6);
  auVar101 = vpmovsxwd_avx(auVar9);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar106);
  auVar116._0_4_ = auVar59._0_4_ * auVar101._0_4_;
  auVar116._4_4_ = auVar59._4_4_ * auVar101._4_4_;
  auVar116._8_4_ = auVar59._8_4_ * auVar101._8_4_;
  auVar116._12_4_ = auVar59._12_4_ * auVar101._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar47 * 0x17 + 6);
  auVar101 = vpmovsxwd_avx(auVar10);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar106);
  auVar58._0_4_ = auVar59._0_4_ * auVar101._0_4_;
  auVar58._4_4_ = auVar59._4_4_ * auVar101._4_4_;
  auVar58._8_4_ = auVar59._8_4_ * auVar101._8_4_;
  auVar58._12_4_ = auVar59._12_4_ * auVar101._12_4_;
  auVar101 = vpminsd_avx(auVar129,auVar140);
  auVar124 = vpminsd_avx(auVar190,auVar85);
  auVar101 = vmaxps_avx(auVar101,auVar124);
  auVar124 = vpminsd_avx(auVar116,auVar58);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar201._4_4_ = uVar54;
  auVar201._0_4_ = uVar54;
  auVar201._8_4_ = uVar54;
  auVar201._12_4_ = uVar54;
  auVar124 = vmaxps_avx(auVar124,auVar201);
  auVar101 = vmaxps_avx(auVar101,auVar124);
  local_378._0_4_ = auVar101._0_4_ * 0.99999964;
  local_378._4_4_ = auVar101._4_4_ * 0.99999964;
  local_378._8_4_ = auVar101._8_4_ * 0.99999964;
  local_378._12_4_ = auVar101._12_4_ * 0.99999964;
  auVar101 = vpmaxsd_avx(auVar129,auVar140);
  auVar124 = vpmaxsd_avx(auVar190,auVar85);
  auVar101 = vminps_avx(auVar101,auVar124);
  auVar124 = vpmaxsd_avx(auVar116,auVar58);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar106._4_4_ = uVar54;
  auVar106._0_4_ = uVar54;
  auVar106._8_4_ = uVar54;
  auVar106._12_4_ = uVar54;
  auVar124 = vminps_avx(auVar124,auVar106);
  auVar101 = vminps_avx(auVar101,auVar124);
  auVar59._0_4_ = auVar101._0_4_ * 1.0000004;
  auVar59._4_4_ = auVar101._4_4_ * 1.0000004;
  auVar59._8_4_ = auVar101._8_4_ * 1.0000004;
  auVar59._12_4_ = auVar101._12_4_ * 1.0000004;
  auVar86[4] = PVar2;
  auVar86._5_3_ = 0;
  auVar86[8] = PVar2;
  auVar86._9_3_ = 0;
  auVar86[0xc] = PVar2;
  auVar86._13_3_ = 0;
  auVar124 = vpcmpgtd_avx(auVar86,_DAT_01f7fcf0);
  auVar101 = vcmpps_avx(local_378,auVar59,2);
  auVar101 = vandps_avx(auVar101,auVar124);
  uVar44 = vmovmskps_avx(auVar101);
  if (uVar44 == 0) {
    return;
  }
  uVar44 = uVar44 & 0xff;
  auVar76._16_16_ = mm_lookupmask_ps._240_16_;
  auVar76._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar76,ZEXT832(0) << 0x20,0x80);
  local_510 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  do {
    lVar48 = 0;
    for (uVar46 = (ulong)uVar44; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
      lVar48 = lVar48 + 1;
    }
    uVar45 = *(uint *)(prim + 2);
    local_398 = *(uint *)(prim + lVar48 * 4 + 6);
    local_508 = (ulong)local_398;
    pGVar3 = (context->scene->geometries).items[uVar45].ptr;
    lVar4 = *(long *)&pGVar3[1].time_range.upper;
    uVar46 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                             local_508 *
                             pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    auVar101 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * uVar46);
    lVar48 = uVar46 + 1;
    auVar124 = *(undefined1 (*) [16])(lVar4 + (long)pGVar3[1].intersectionFilterN * lVar48);
    _Var5 = pGVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar121 = *(undefined1 (*) [16])(_Var5 + (long)pGVar3[2].userPtr * uVar46);
    auVar8 = *(undefined1 (*) [16])(_Var5 + (long)pGVar3[2].userPtr * lVar48);
    auVar9 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar87._8_4_ = 0x3eaaaaab;
    auVar87._0_8_ = 0x3eaaaaab3eaaaaab;
    auVar87._12_4_ = 0x3eaaaaab;
    auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])
                               (pGVar3[2].intersectionFilterN +
                               (long)pGVar3[2].pointQueryFunc * uVar46),auVar101,auVar87);
    auVar85 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                (pGVar3[2].intersectionFilterN +
                                (long)pGVar3[2].pointQueryFunc * lVar48),auVar124,auVar87);
    auVar59 = vfmadd132ps_fma(*(undefined1 (*) [16])
                               ((long)pGVar3[3].userPtr +
                               uVar46 * *(long *)&pGVar3[3].fnumTimeSegments),auVar121,auVar87);
    auVar57 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                ((long)pGVar3[3].userPtr +
                                *(long *)&pGVar3[3].fnumTimeSegments * lVar48),auVar8,auVar87);
    auVar116 = ZEXT816(0) << 0x40;
    auVar88._0_4_ = auVar124._0_4_ * 0.0;
    auVar88._4_4_ = auVar124._4_4_ * 0.0;
    auVar88._8_4_ = auVar124._8_4_ * 0.0;
    auVar88._12_4_ = auVar124._12_4_ * 0.0;
    auVar106 = vfmadd231ps_fma(auVar88,auVar85,auVar116);
    auVar58 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar10,auVar106);
    local_648._0_4_ = auVar101._0_4_ + auVar58._0_4_;
    local_648._4_4_ = auVar101._4_4_ + auVar58._4_4_;
    fStack_640 = auVar101._8_4_ + auVar58._8_4_;
    fStack_63c = auVar101._12_4_ + auVar58._12_4_;
    auVar60._8_4_ = 0x40400000;
    auVar60._0_8_ = 0x4040000040400000;
    auVar60._12_4_ = 0x40400000;
    auVar58 = vfmadd231ps_fma(auVar106,auVar10,auVar60);
    auVar86 = vfnmadd231ps_fma(auVar58,auVar101,auVar60);
    auVar234._0_4_ = auVar8._0_4_ * 0.0;
    auVar234._4_4_ = auVar8._4_4_ * 0.0;
    auVar234._8_4_ = auVar8._8_4_ * 0.0;
    auVar234._12_4_ = auVar8._12_4_ * 0.0;
    auVar106 = vfmadd231ps_fma(auVar234,auVar57,auVar116);
    auVar58 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar59,auVar106);
    auVar254._0_4_ = auVar121._0_4_ + auVar58._0_4_;
    auVar254._4_4_ = auVar121._4_4_ + auVar58._4_4_;
    auVar254._8_4_ = auVar121._8_4_ + auVar58._8_4_;
    auVar254._12_4_ = auVar121._12_4_ + auVar58._12_4_;
    auVar58 = vfmadd231ps_fma(auVar106,auVar59,auVar60);
    auVar106 = vfnmadd231ps_fma(auVar58,auVar121,auVar60);
    auVar58 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar85,auVar124);
    auVar58 = vfmadd231ps_fma(auVar58,auVar10,auVar116);
    auVar58 = vfmadd231ps_fma(auVar58,auVar101,auVar116);
    auVar130._0_4_ = auVar124._0_4_ * 3.0;
    auVar130._4_4_ = auVar124._4_4_ * 3.0;
    auVar130._8_4_ = auVar124._8_4_ * 3.0;
    auVar130._12_4_ = auVar124._12_4_ * 3.0;
    auVar124 = vfnmadd231ps_fma(auVar130,auVar60,auVar85);
    auVar124 = vfmadd231ps_fma(auVar124,auVar116,auVar10);
    auVar85 = vfnmadd231ps_fma(auVar124,auVar116,auVar101);
    auVar101 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar57,auVar8);
    auVar101 = vfmadd231ps_fma(auVar101,auVar59,auVar116);
    auVar10 = vfmadd231ps_fma(auVar101,auVar121,auVar116);
    auVar172._0_4_ = auVar8._0_4_ * 3.0;
    auVar172._4_4_ = auVar8._4_4_ * 3.0;
    auVar172._8_4_ = auVar8._8_4_ * 3.0;
    auVar172._12_4_ = auVar8._12_4_ * 3.0;
    auVar101 = vfnmadd231ps_fma(auVar172,auVar60,auVar57);
    auVar101 = vfmadd231ps_fma(auVar101,auVar116,auVar59);
    auVar59 = vfnmadd231ps_fma(auVar101,auVar116,auVar121);
    auVar101 = vshufps_avx(auVar86,auVar86,0xc9);
    auVar124 = vshufps_avx(auVar254,auVar254,0xc9);
    fVar53 = auVar86._0_4_;
    auVar191._0_4_ = auVar124._0_4_ * fVar53;
    fVar80 = auVar86._4_4_;
    auVar191._4_4_ = auVar124._4_4_ * fVar80;
    fVar115 = auVar86._8_4_;
    auVar191._8_4_ = auVar124._8_4_ * fVar115;
    fVar55 = auVar86._12_4_;
    auVar191._12_4_ = auVar124._12_4_ * fVar55;
    auVar124 = vfmsub231ps_fma(auVar191,auVar101,auVar254);
    auVar121 = vshufps_avx(auVar124,auVar124,0xc9);
    auVar124 = vshufps_avx(auVar106,auVar106,0xc9);
    auVar202._0_4_ = auVar124._0_4_ * fVar53;
    auVar202._4_4_ = auVar124._4_4_ * fVar80;
    auVar202._8_4_ = auVar124._8_4_ * fVar115;
    auVar202._12_4_ = auVar124._12_4_ * fVar55;
    auVar101 = vfmsub231ps_fma(auVar202,auVar101,auVar106);
    auVar8 = vshufps_avx(auVar101,auVar101,0xc9);
    auVar101 = vshufps_avx(auVar85,auVar85,0xc9);
    auVar124 = vshufps_avx(auVar10,auVar10,0xc9);
    fVar56 = auVar85._0_4_;
    auVar219._0_4_ = auVar124._0_4_ * fVar56;
    fVar81 = auVar85._4_4_;
    auVar219._4_4_ = auVar124._4_4_ * fVar81;
    fVar79 = auVar85._8_4_;
    auVar219._8_4_ = auVar124._8_4_ * fVar79;
    fVar82 = auVar85._12_4_;
    auVar219._12_4_ = auVar124._12_4_ * fVar82;
    auVar124 = vfmsub231ps_fma(auVar219,auVar101,auVar10);
    auVar10 = vshufps_avx(auVar124,auVar124,0xc9);
    auVar124 = vshufps_avx(auVar59,auVar59,0xc9);
    auVar220._0_4_ = auVar124._0_4_ * fVar56;
    auVar220._4_4_ = auVar124._4_4_ * fVar81;
    auVar220._8_4_ = auVar124._8_4_ * fVar79;
    auVar220._12_4_ = auVar124._12_4_ * fVar82;
    auVar101 = vfmsub231ps_fma(auVar220,auVar101,auVar59);
    auVar59 = vshufps_avx(auVar101,auVar101,0xc9);
    auVar101 = vdpps_avx(auVar121,auVar121,0x7f);
    fVar217 = auVar101._0_4_;
    auVar235._4_12_ = ZEXT812(0) << 0x20;
    auVar235._0_4_ = fVar217;
    auVar124 = vrsqrtss_avx(auVar235,auVar235);
    fVar170 = auVar124._0_4_;
    fVar127 = fVar170 * 1.5 - fVar217 * 0.5 * fVar170 * fVar170 * fVar170;
    auVar124 = vdpps_avx(auVar121,auVar8,0x7f);
    fVar152 = auVar121._0_4_ * fVar127;
    fVar167 = auVar121._4_4_ * fVar127;
    fVar168 = auVar121._8_4_ * fVar127;
    fVar169 = auVar121._12_4_ * fVar127;
    auVar203._0_4_ = fVar217 * auVar8._0_4_;
    auVar203._4_4_ = fVar217 * auVar8._4_4_;
    auVar203._8_4_ = fVar217 * auVar8._8_4_;
    auVar203._12_4_ = fVar217 * auVar8._12_4_;
    fVar170 = auVar124._0_4_;
    auVar192._0_4_ = fVar170 * auVar121._0_4_;
    auVar192._4_4_ = fVar170 * auVar121._4_4_;
    auVar192._8_4_ = fVar170 * auVar121._8_4_;
    auVar192._12_4_ = fVar170 * auVar121._12_4_;
    auVar121 = vsubps_avx(auVar203,auVar192);
    auVar124 = vrcpss_avx(auVar235,auVar235);
    auVar101 = vfnmadd213ss_fma(auVar101,auVar124,SUB6416(ZEXT464(0x40000000),0));
    fVar170 = auVar124._0_4_ * auVar101._0_4_;
    auVar101 = vdpps_avx(auVar10,auVar10,0x7f);
    fVar217 = auVar101._0_4_;
    auVar221._4_12_ = ZEXT812(0) << 0x20;
    auVar221._0_4_ = fVar217;
    auVar124 = vrsqrtss_avx(auVar221,auVar221);
    fVar138 = auVar124._0_4_;
    auVar124 = vdpps_avx(auVar10,auVar59,0x7f);
    fVar138 = fVar138 * 1.5 - fVar217 * 0.5 * fVar138 * fVar138 * fVar138;
    fVar240 = fVar138 * auVar10._0_4_;
    fVar251 = fVar138 * auVar10._4_4_;
    fVar252 = fVar138 * auVar10._8_4_;
    fVar253 = fVar138 * auVar10._12_4_;
    auVar173._0_4_ = fVar217 * auVar59._0_4_;
    auVar173._4_4_ = fVar217 * auVar59._4_4_;
    auVar173._8_4_ = fVar217 * auVar59._8_4_;
    auVar173._12_4_ = fVar217 * auVar59._12_4_;
    fVar217 = auVar124._0_4_;
    auVar141._0_4_ = fVar217 * auVar10._0_4_;
    auVar141._4_4_ = fVar217 * auVar10._4_4_;
    auVar141._8_4_ = fVar217 * auVar10._8_4_;
    auVar141._12_4_ = fVar217 * auVar10._12_4_;
    auVar8 = vsubps_avx(auVar173,auVar141);
    auVar124 = vrcpss_avx(auVar221,auVar221);
    auVar101 = vfnmadd213ss_fma(auVar101,auVar124,ZEXT416(0x40000000));
    fVar217 = auVar101._0_4_ * auVar124._0_4_;
    auVar101 = vshufps_avx(_local_648,_local_648,0xff);
    auVar204._0_4_ = auVar101._0_4_ * fVar152;
    auVar204._4_4_ = auVar101._4_4_ * fVar167;
    auVar204._8_4_ = auVar101._8_4_ * fVar168;
    auVar204._12_4_ = auVar101._12_4_ * fVar169;
    local_428 = vsubps_avx(_local_648,auVar204);
    auVar124 = vshufps_avx(auVar86,auVar86,0xff);
    auVar153._0_4_ = auVar124._0_4_ * fVar152 + fVar127 * auVar121._0_4_ * fVar170 * auVar101._0_4_;
    auVar153._4_4_ = auVar124._4_4_ * fVar167 + fVar127 * auVar121._4_4_ * fVar170 * auVar101._4_4_;
    auVar153._8_4_ = auVar124._8_4_ * fVar168 + fVar127 * auVar121._8_4_ * fVar170 * auVar101._8_4_;
    auVar153._12_4_ =
         auVar124._12_4_ * fVar169 + fVar127 * auVar121._12_4_ * fVar170 * auVar101._12_4_;
    auVar121 = vsubps_avx(auVar86,auVar153);
    local_438._0_4_ = auVar204._0_4_ + (float)local_648._0_4_;
    local_438._4_4_ = auVar204._4_4_ + (float)local_648._4_4_;
    fStack_430 = auVar204._8_4_ + fStack_640;
    fStack_42c = auVar204._12_4_ + fStack_63c;
    auVar101 = vshufps_avx(auVar58,auVar58,0xff);
    auVar107._0_4_ = fVar240 * auVar101._0_4_;
    auVar107._4_4_ = fVar251 * auVar101._4_4_;
    auVar107._8_4_ = fVar252 * auVar101._8_4_;
    auVar107._12_4_ = fVar253 * auVar101._12_4_;
    local_448 = vsubps_avx(auVar58,auVar107);
    auVar124 = vshufps_avx(auVar85,auVar85,0xff);
    auVar89._0_4_ = fVar240 * auVar124._0_4_ + auVar101._0_4_ * fVar138 * auVar8._0_4_ * fVar217;
    auVar89._4_4_ = fVar251 * auVar124._4_4_ + auVar101._4_4_ * fVar138 * auVar8._4_4_ * fVar217;
    auVar89._8_4_ = fVar252 * auVar124._8_4_ + auVar101._8_4_ * fVar138 * auVar8._8_4_ * fVar217;
    auVar89._12_4_ = fVar253 * auVar124._12_4_ + auVar101._12_4_ * fVar138 * auVar8._12_4_ * fVar217
    ;
    auVar101 = vsubps_avx(auVar85,auVar89);
    fVar152 = auVar58._0_4_ + auVar107._0_4_;
    fVar167 = auVar58._4_4_ + auVar107._4_4_;
    fVar168 = auVar58._8_4_ + auVar107._8_4_;
    fVar169 = auVar58._12_4_ + auVar107._12_4_;
    local_458._0_4_ = local_428._0_4_ + auVar121._0_4_ * 0.33333334;
    local_458._4_4_ = local_428._4_4_ + auVar121._4_4_ * 0.33333334;
    local_458._8_4_ = local_428._8_4_ + auVar121._8_4_ * 0.33333334;
    local_458._12_4_ = local_428._12_4_ + auVar121._12_4_ * 0.33333334;
    auVar90._0_4_ = auVar101._0_4_ * 0.33333334;
    auVar90._4_4_ = auVar101._4_4_ * 0.33333334;
    auVar90._8_4_ = auVar101._8_4_ * 0.33333334;
    auVar90._12_4_ = auVar101._12_4_ * 0.33333334;
    local_468 = vsubps_avx(local_448,auVar90);
    local_408 = vsubps_avx(local_428,auVar9);
    auVar101 = vshufps_avx(local_408,local_408,0x55);
    auVar124 = vshufps_avx(local_408,local_408,0xaa);
    aVar1 = pre->ray_space[k].vy.field_0;
    fVar170 = pre->ray_space[k].vz.field_0.m128[0];
    fVar217 = pre->ray_space[k].vz.field_0.m128[1];
    fVar127 = pre->ray_space[k].vz.field_0.m128[2];
    fVar138 = pre->ray_space[k].vz.field_0.m128[3];
    auVar91._0_4_ = fVar170 * auVar124._0_4_;
    auVar91._4_4_ = fVar217 * auVar124._4_4_;
    auVar91._8_4_ = fVar127 * auVar124._8_4_;
    auVar91._12_4_ = fVar138 * auVar124._12_4_;
    auVar121 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar1,auVar101);
    local_418 = vsubps_avx(local_458,auVar9);
    auVar101 = vshufps_avx(local_418,local_418,0x55);
    auVar124 = vshufps_avx(local_418,local_418,0xaa);
    auVar272._0_4_ = fVar170 * auVar124._0_4_;
    auVar272._4_4_ = fVar217 * auVar124._4_4_;
    auVar272._8_4_ = fVar127 * auVar124._8_4_;
    auVar272._12_4_ = fVar138 * auVar124._12_4_;
    auVar124 = vfmadd231ps_fma(auVar272,(undefined1  [16])aVar1,auVar101);
    local_2c8 = vsubps_avx(local_468,auVar9);
    auVar101 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar241._0_4_ = fVar170 * auVar101._0_4_;
    auVar241._4_4_ = fVar217 * auVar101._4_4_;
    auVar241._8_4_ = fVar127 * auVar101._8_4_;
    auVar241._12_4_ = fVar138 * auVar101._12_4_;
    auVar101 = vshufps_avx(local_2c8,local_2c8,0x55);
    auVar8 = vfmadd231ps_fma(auVar241,(undefined1  [16])aVar1,auVar101);
    local_2d8 = vsubps_avx(local_448,auVar9);
    auVar101 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar255._0_4_ = fVar170 * auVar101._0_4_;
    auVar255._4_4_ = fVar217 * auVar101._4_4_;
    auVar255._8_4_ = fVar127 * auVar101._8_4_;
    auVar255._12_4_ = fVar138 * auVar101._12_4_;
    auVar101 = vshufps_avx(local_2d8,local_2d8,0x55);
    auVar10 = vfmadd231ps_fma(auVar255,(undefined1  [16])aVar1,auVar101);
    local_2e8 = vsubps_avx(_local_438,auVar9);
    auVar101 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar142._0_4_ = fVar170 * auVar101._0_4_;
    auVar142._4_4_ = fVar217 * auVar101._4_4_;
    auVar142._8_4_ = fVar127 * auVar101._8_4_;
    auVar142._12_4_ = fVar138 * auVar101._12_4_;
    auVar101 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar59 = vfmadd231ps_fma(auVar142,(undefined1  [16])aVar1,auVar101);
    local_478._0_4_ = (fVar53 + auVar153._0_4_) * 0.33333334 + (float)local_438._0_4_;
    local_478._4_4_ = (fVar80 + auVar153._4_4_) * 0.33333334 + (float)local_438._4_4_;
    fStack_470 = (fVar115 + auVar153._8_4_) * 0.33333334 + fStack_430;
    fStack_46c = (fVar55 + auVar153._12_4_) * 0.33333334 + fStack_42c;
    local_2f8 = vsubps_avx(_local_478,auVar9);
    auVar101 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar193._0_4_ = auVar101._0_4_ * fVar170;
    auVar193._4_4_ = auVar101._4_4_ * fVar217;
    auVar193._8_4_ = auVar101._8_4_ * fVar127;
    auVar193._12_4_ = auVar101._12_4_ * fVar138;
    auVar101 = vshufps_avx(local_2f8,local_2f8,0x55);
    auVar58 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar1,auVar101);
    auVar205._0_4_ = (fVar56 + auVar89._0_4_) * 0.33333334;
    auVar205._4_4_ = (fVar81 + auVar89._4_4_) * 0.33333334;
    auVar205._8_4_ = (fVar79 + auVar89._8_4_) * 0.33333334;
    auVar205._12_4_ = (fVar82 + auVar89._12_4_) * 0.33333334;
    auVar40._4_4_ = fVar167;
    auVar40._0_4_ = fVar152;
    auVar40._8_4_ = fVar168;
    auVar40._12_4_ = fVar169;
    _local_488 = vsubps_avx(auVar40,auVar205);
    local_308 = vsubps_avx(_local_488,auVar9);
    auVar101 = vshufps_avx(local_308,local_308,0xaa);
    auVar206._0_4_ = auVar101._0_4_ * fVar170;
    auVar206._4_4_ = auVar101._4_4_ * fVar217;
    auVar206._8_4_ = auVar101._8_4_ * fVar127;
    auVar206._12_4_ = auVar101._12_4_ * fVar138;
    auVar101 = vshufps_avx(local_308,local_308,0x55);
    auVar106 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar1,auVar101);
    local_318 = vsubps_avx(auVar40,auVar9);
    auVar101 = vshufps_avx(local_318,local_318,0xaa);
    auVar61._0_4_ = fVar170 * auVar101._0_4_;
    auVar61._4_4_ = fVar217 * auVar101._4_4_;
    auVar61._8_4_ = fVar127 * auVar101._8_4_;
    auVar61._12_4_ = fVar138 * auVar101._12_4_;
    auVar101 = vshufps_avx(local_318,local_318,0x55);
    auVar101 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar1,auVar101);
    auVar154._4_4_ = local_408._0_4_;
    auVar154._0_4_ = local_408._0_4_;
    auVar154._8_4_ = local_408._0_4_;
    auVar154._12_4_ = local_408._0_4_;
    aVar1 = pre->ray_space[k].vx.field_0;
    auVar85 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar1,auVar154);
    auVar155._4_4_ = local_418._0_4_;
    auVar155._0_4_ = local_418._0_4_;
    auVar155._8_4_ = local_418._0_4_;
    auVar155._12_4_ = local_418._0_4_;
    auVar57 = vfmadd231ps_fma(auVar124,(undefined1  [16])aVar1,auVar155);
    uVar54 = local_2c8._0_4_;
    auVar156._4_4_ = uVar54;
    auVar156._0_4_ = uVar54;
    auVar156._8_4_ = uVar54;
    auVar156._12_4_ = uVar54;
    auVar86 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar156);
    uVar54 = local_2d8._0_4_;
    auVar157._4_4_ = uVar54;
    auVar157._0_4_ = uVar54;
    auVar157._8_4_ = uVar54;
    auVar157._12_4_ = uVar54;
    auVar116 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar1,auVar157);
    uVar54 = local_2e8._0_4_;
    auVar158._4_4_ = uVar54;
    auVar158._0_4_ = uVar54;
    auVar158._8_4_ = uVar54;
    auVar158._12_4_ = uVar54;
    auVar59 = vfmadd231ps_fma(auVar59,(undefined1  [16])aVar1,auVar158);
    uVar54 = local_2f8._0_4_;
    auVar159._4_4_ = uVar54;
    auVar159._0_4_ = uVar54;
    auVar159._8_4_ = uVar54;
    auVar159._12_4_ = uVar54;
    auVar58 = vfmadd231ps_fma(auVar58,(undefined1  [16])aVar1,auVar159);
    uVar54 = local_308._0_4_;
    auVar160._4_4_ = uVar54;
    auVar160._0_4_ = uVar54;
    auVar160._8_4_ = uVar54;
    auVar160._12_4_ = uVar54;
    auVar106 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar1,auVar160);
    uVar54 = local_318._0_4_;
    auVar161._4_4_ = uVar54;
    auVar161._0_4_ = uVar54;
    auVar161._8_4_ = uVar54;
    auVar161._12_4_ = uVar54;
    auVar129 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar1,auVar161);
    auVar8 = vmovlhps_avx(auVar85,auVar59);
    auVar9 = vmovlhps_avx(auVar57,auVar58);
    auVar10 = vmovlhps_avx(auVar86,auVar106);
    _local_278 = vmovlhps_avx(auVar116,auVar129);
    auVar101 = vminps_avx(auVar8,auVar9);
    auVar124 = vminps_avx(auVar10,_local_278);
    auVar121 = vminps_avx(auVar101,auVar124);
    auVar101 = vmaxps_avx(auVar8,auVar9);
    auVar124 = vmaxps_avx(auVar10,_local_278);
    auVar101 = vmaxps_avx(auVar101,auVar124);
    auVar124 = vshufpd_avx(auVar121,auVar121,3);
    auVar121 = vminps_avx(auVar121,auVar124);
    auVar124 = vshufpd_avx(auVar101,auVar101,3);
    auVar124 = vmaxps_avx(auVar101,auVar124);
    auVar101 = vandps_avx(local_3f8,auVar121);
    auVar124 = vandps_avx(local_3f8,auVar124);
    auVar101 = vmaxps_avx(auVar101,auVar124);
    auVar124 = vmovshdup_avx(auVar101);
    auVar101 = vmaxss_avx(auVar124,auVar101);
    local_500 = (ulong)uVar44 + 0xf;
    local_78 = auVar101._0_4_ * 9.536743e-07;
    auVar174._8_8_ = auVar85._0_8_;
    auVar174._0_8_ = auVar85._0_8_;
    auVar222._8_8_ = auVar57._0_8_;
    auVar222._0_8_ = auVar57._0_8_;
    auVar242._0_8_ = auVar86._0_8_;
    auVar242._8_8_ = auVar242._0_8_;
    auVar256._0_8_ = auVar116._0_8_;
    auVar256._8_8_ = auVar256._0_8_;
    local_288 = ZEXT416((uint)local_78);
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    fStack_68 = local_78;
    fStack_64 = local_78;
    fStack_60 = local_78;
    fStack_5c = local_78;
    local_98 = -local_78;
    fStack_94 = local_98;
    fStack_90 = local_98;
    fStack_8c = local_98;
    fStack_88 = local_98;
    fStack_84 = local_98;
    fStack_80 = local_98;
    fStack_7c = local_98;
    local_388 = uVar45;
    uStack_384 = uVar45;
    uStack_380 = uVar45;
    uStack_37c = uVar45;
    uStack_394 = local_398;
    uStack_390 = local_398;
    uStack_38c = local_398;
    uVar52 = 0;
    fVar53 = *(float *)(ray + k * 4 + 0x30);
    local_298 = vsubps_avx(auVar9,auVar8);
    local_2a8 = vsubps_avx(auVar10,auVar9);
    local_2b8 = vsubps_avx(_local_278,auVar10);
    local_338 = vsubps_avx(_local_438,local_428);
    local_348 = vsubps_avx(_local_478,local_458);
    local_358 = vsubps_avx(_local_488,local_468);
    auVar41._4_4_ = fVar167;
    auVar41._0_4_ = fVar152;
    auVar41._8_4_ = fVar168;
    auVar41._12_4_ = fVar169;
    _local_368 = vsubps_avx(auVar41,local_448);
    auVar62 = ZEXT816(0x3f80000000000000);
    local_328 = auVar62;
LAB_015fac84:
    auVar101 = vshufps_avx(auVar62,auVar62,0x50);
    auVar273._8_4_ = 0x3f800000;
    auVar273._0_8_ = 0x3f8000003f800000;
    auVar273._12_4_ = 0x3f800000;
    auVar276._16_4_ = 0x3f800000;
    auVar276._0_16_ = auVar273;
    auVar276._20_4_ = 0x3f800000;
    auVar276._24_4_ = 0x3f800000;
    auVar276._28_4_ = 0x3f800000;
    auVar124 = vsubps_avx(auVar273,auVar101);
    fVar56 = auVar101._0_4_;
    fVar127 = auVar59._0_4_;
    auVar63._0_4_ = fVar127 * fVar56;
    fVar80 = auVar101._4_4_;
    fVar138 = auVar59._4_4_;
    auVar63._4_4_ = fVar138 * fVar80;
    fVar81 = auVar101._8_4_;
    auVar63._8_4_ = fVar127 * fVar81;
    fVar115 = auVar101._12_4_;
    auVar63._12_4_ = fVar138 * fVar115;
    fVar240 = auVar58._0_4_;
    auVar162._0_4_ = fVar240 * fVar56;
    fVar251 = auVar58._4_4_;
    auVar162._4_4_ = fVar251 * fVar80;
    auVar162._8_4_ = fVar240 * fVar81;
    auVar162._12_4_ = fVar251 * fVar115;
    fVar188 = auVar106._0_4_;
    auVar131._0_4_ = fVar188 * fVar56;
    fVar199 = auVar106._4_4_;
    auVar131._4_4_ = fVar199 * fVar80;
    auVar131._8_4_ = fVar188 * fVar81;
    auVar131._12_4_ = fVar199 * fVar115;
    fVar200 = auVar129._0_4_;
    auVar108._0_4_ = fVar200 * fVar56;
    fVar216 = auVar129._4_4_;
    auVar108._4_4_ = fVar216 * fVar80;
    auVar108._8_4_ = fVar200 * fVar81;
    auVar108._12_4_ = fVar216 * fVar115;
    auVar57 = vfmadd231ps_fma(auVar63,auVar124,auVar174);
    auVar86 = vfmadd231ps_fma(auVar162,auVar124,auVar222);
    auVar116 = vfmadd231ps_fma(auVar131,auVar124,auVar242);
    auVar236 = vfmadd231ps_fma(auVar108,auVar256,auVar124);
    auVar101 = vmovshdup_avx(local_328);
    fVar56 = local_328._0_4_;
    fStack_140 = (auVar101._0_4_ - fVar56) * 0.04761905;
    auVar214._4_4_ = fVar56;
    auVar214._0_4_ = fVar56;
    auVar214._8_4_ = fVar56;
    auVar214._12_4_ = fVar56;
    auVar214._16_4_ = fVar56;
    auVar214._20_4_ = fVar56;
    auVar214._24_4_ = fVar56;
    auVar214._28_4_ = fVar56;
    auVar102._0_8_ = auVar101._0_8_;
    auVar102._8_8_ = auVar102._0_8_;
    auVar102._16_8_ = auVar102._0_8_;
    auVar102._24_8_ = auVar102._0_8_;
    auVar76 = vsubps_avx(auVar102,auVar214);
    uVar54 = auVar57._0_4_;
    auVar270._4_4_ = uVar54;
    auVar270._0_4_ = uVar54;
    auVar270._8_4_ = uVar54;
    auVar270._12_4_ = uVar54;
    auVar270._16_4_ = uVar54;
    auVar270._20_4_ = uVar54;
    auVar270._24_4_ = uVar54;
    auVar270._28_4_ = uVar54;
    auVar101 = vmovshdup_avx(auVar57);
    uVar83 = auVar101._0_8_;
    auVar264._8_8_ = uVar83;
    auVar264._0_8_ = uVar83;
    auVar264._16_8_ = uVar83;
    auVar264._24_8_ = uVar83;
    fVar217 = auVar86._0_4_;
    auVar247._4_4_ = fVar217;
    auVar247._0_4_ = fVar217;
    auVar247._8_4_ = fVar217;
    auVar247._12_4_ = fVar217;
    auVar247._16_4_ = fVar217;
    auVar247._20_4_ = fVar217;
    auVar247._24_4_ = fVar217;
    auVar247._28_4_ = fVar217;
    auVar124 = vmovshdup_avx(auVar86);
    auVar103._0_8_ = auVar124._0_8_;
    auVar103._8_8_ = auVar103._0_8_;
    auVar103._16_8_ = auVar103._0_8_;
    auVar103._24_8_ = auVar103._0_8_;
    fVar170 = auVar116._0_4_;
    auVar180._4_4_ = fVar170;
    auVar180._0_4_ = fVar170;
    auVar180._8_4_ = fVar170;
    auVar180._12_4_ = fVar170;
    auVar180._16_4_ = fVar170;
    auVar180._20_4_ = fVar170;
    auVar180._24_4_ = fVar170;
    auVar180._28_4_ = fVar170;
    auVar121 = vmovshdup_avx(auVar116);
    auVar197._0_8_ = auVar121._0_8_;
    auVar197._8_8_ = auVar197._0_8_;
    auVar197._16_8_ = auVar197._0_8_;
    auVar197._24_8_ = auVar197._0_8_;
    fVar82 = auVar236._0_4_;
    auVar85 = vmovshdup_avx(auVar236);
    auVar84 = vfmadd132ps_fma(auVar76,auVar214,_DAT_01faff20);
    auVar76 = vsubps_avx(auVar276,ZEXT1632(auVar84));
    fVar56 = auVar84._0_4_;
    fVar80 = auVar84._4_4_;
    auVar11._4_4_ = fVar217 * fVar80;
    auVar11._0_4_ = fVar217 * fVar56;
    fVar81 = auVar84._8_4_;
    auVar11._8_4_ = fVar217 * fVar81;
    fVar115 = auVar84._12_4_;
    auVar11._12_4_ = fVar217 * fVar115;
    auVar11._16_4_ = fVar217 * 0.0;
    auVar11._20_4_ = fVar217 * 0.0;
    auVar11._24_4_ = fVar217 * 0.0;
    auVar11._28_4_ = 0x3f800000;
    auVar84 = vfmadd231ps_fma(auVar11,auVar76,auVar270);
    fVar79 = auVar124._0_4_;
    fVar55 = auVar124._4_4_;
    auVar12._4_4_ = fVar55 * fVar80;
    auVar12._0_4_ = fVar79 * fVar56;
    auVar12._8_4_ = fVar79 * fVar81;
    auVar12._12_4_ = fVar55 * fVar115;
    auVar12._16_4_ = fVar79 * 0.0;
    auVar12._20_4_ = fVar55 * 0.0;
    auVar12._24_4_ = fVar79 * 0.0;
    auVar12._28_4_ = uVar54;
    auVar128 = vfmadd231ps_fma(auVar12,auVar76,auVar264);
    auVar13._4_4_ = fVar170 * fVar80;
    auVar13._0_4_ = fVar170 * fVar56;
    auVar13._8_4_ = fVar170 * fVar81;
    auVar13._12_4_ = fVar170 * fVar115;
    auVar13._16_4_ = fVar170 * 0.0;
    auVar13._20_4_ = fVar170 * 0.0;
    auVar13._24_4_ = fVar170 * 0.0;
    auVar13._28_4_ = auVar101._4_4_;
    auVar118 = vfmadd231ps_fma(auVar13,auVar76,auVar247);
    fVar79 = auVar121._0_4_;
    fVar55 = auVar121._4_4_;
    auVar7._4_4_ = fVar55 * fVar80;
    auVar7._0_4_ = fVar79 * fVar56;
    auVar7._8_4_ = fVar79 * fVar81;
    auVar7._12_4_ = fVar55 * fVar115;
    auVar7._16_4_ = fVar79 * 0.0;
    auVar7._20_4_ = fVar55 * 0.0;
    auVar7._24_4_ = fVar79 * 0.0;
    auVar7._28_4_ = fVar217;
    auVar139 = vfmadd231ps_fma(auVar7,auVar76,auVar103);
    auVar101 = vshufps_avx(auVar57,auVar57,0xaa);
    local_548._8_8_ = auVar101._0_8_;
    local_548._0_8_ = local_548._8_8_;
    local_548._16_8_ = local_548._8_8_;
    local_548._24_8_ = local_548._8_8_;
    auVar124 = vshufps_avx(auVar57,auVar57,0xff);
    uStack_620 = auVar124._0_8_;
    local_628 = (undefined1  [8])uStack_620;
    uStack_618 = uStack_620;
    uStack_610 = uStack_620;
    auVar14._4_4_ = fVar82 * fVar80;
    auVar14._0_4_ = fVar82 * fVar56;
    auVar14._8_4_ = fVar82 * fVar81;
    auVar14._12_4_ = fVar82 * fVar115;
    auVar14._16_4_ = fVar82 * 0.0;
    auVar14._20_4_ = fVar82 * 0.0;
    auVar14._24_4_ = fVar82 * 0.0;
    auVar14._28_4_ = fVar82;
    auVar57 = vfmadd231ps_fma(auVar14,auVar76,auVar180);
    auVar124 = vshufps_avx(auVar86,auVar86,0xaa);
    auVar181._0_8_ = auVar124._0_8_;
    auVar181._8_8_ = auVar181._0_8_;
    auVar181._16_8_ = auVar181._0_8_;
    auVar181._24_8_ = auVar181._0_8_;
    auVar121 = vshufps_avx(auVar86,auVar86,0xff);
    local_4d8._8_8_ = auVar121._0_8_;
    local_4d8._0_8_ = local_4d8._8_8_;
    local_4d8._16_8_ = local_4d8._8_8_;
    local_4d8._24_8_ = local_4d8._8_8_;
    fVar79 = auVar85._0_4_;
    fVar55 = auVar85._4_4_;
    auVar249._4_4_ = fVar55 * fVar80;
    auVar249._0_4_ = fVar79 * fVar56;
    auVar249._8_4_ = fVar79 * fVar81;
    auVar249._12_4_ = fVar55 * fVar115;
    auVar249._16_4_ = fVar79 * 0.0;
    auVar249._20_4_ = fVar55 * 0.0;
    auVar249._24_4_ = fVar79 * 0.0;
    auVar249._28_4_ = auVar101._4_4_;
    auVar140 = vfmadd231ps_fma(auVar249,auVar76,auVar197);
    auVar16._28_4_ = fVar55;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar118._12_4_ * fVar115,
                            CONCAT48(auVar118._8_4_ * fVar81,
                                     CONCAT44(auVar118._4_4_ * fVar80,auVar118._0_4_ * fVar56))));
    auVar84 = vfmadd231ps_fma(auVar16,auVar76,ZEXT1632(auVar84));
    fVar79 = auVar121._4_4_;
    auVar17._28_4_ = fVar79;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar139._12_4_ * fVar115,
                            CONCAT48(auVar139._8_4_ * fVar81,
                                     CONCAT44(auVar139._4_4_ * fVar80,auVar139._0_4_ * fVar56))));
    auVar128 = vfmadd231ps_fma(auVar17,auVar76,ZEXT1632(auVar128));
    auVar101 = vshufps_avx(auVar116,auVar116,0xaa);
    uVar83 = auVar101._0_8_;
    auVar166._8_8_ = uVar83;
    auVar166._0_8_ = uVar83;
    auVar166._16_8_ = uVar83;
    auVar166._24_8_ = uVar83;
    auVar85 = vshufps_avx(auVar116,auVar116,0xff);
    uVar83 = auVar85._0_8_;
    auVar277._8_8_ = uVar83;
    auVar277._0_8_ = uVar83;
    auVar277._16_8_ = uVar83;
    auVar277._24_8_ = uVar83;
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar57._12_4_ * fVar115,
                                                  CONCAT48(auVar57._8_4_ * fVar81,
                                                           CONCAT44(auVar57._4_4_ * fVar80,
                                                                    auVar57._0_4_ * fVar56)))),
                               auVar76,ZEXT1632(auVar118));
    auVar57 = vshufps_avx(auVar236,auVar236,0xaa);
    auVar86 = vshufps_avx(auVar236,auVar236,0xff);
    auVar236 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar140._12_4_,
                                                  CONCAT48(fVar81 * auVar140._8_4_,
                                                           CONCAT44(fVar80 * auVar140._4_4_,
                                                                    fVar56 * auVar140._0_4_)))),
                               auVar76,ZEXT1632(auVar139));
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar116._12_4_,
                                                  CONCAT48(fVar81 * auVar116._8_4_,
                                                           CONCAT44(fVar80 * auVar116._4_4_,
                                                                    fVar56 * auVar116._0_4_)))),
                               auVar76,ZEXT1632(auVar84));
    auVar11 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar84));
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar236._12_4_,
                                                  CONCAT48(fVar81 * auVar236._8_4_,
                                                           CONCAT44(fVar80 * auVar236._4_4_,
                                                                    fVar56 * auVar236._0_4_)))),
                               auVar76,ZEXT1632(auVar128));
    auVar12 = vsubps_avx(ZEXT1632(auVar236),ZEXT1632(auVar128));
    fVar55 = auVar12._28_4_;
    auVar248._0_4_ = fStack_140 * auVar11._0_4_ * 3.0;
    auVar248._4_4_ = fStack_140 * auVar11._4_4_ * 3.0;
    auVar248._8_4_ = fStack_140 * auVar11._8_4_ * 3.0;
    auVar248._12_4_ = fStack_140 * auVar11._12_4_ * 3.0;
    auVar248._16_4_ = fStack_140 * auVar11._16_4_ * 3.0;
    auVar248._20_4_ = fStack_140 * auVar11._20_4_ * 3.0;
    auVar248._24_4_ = fStack_140 * auVar11._24_4_ * 3.0;
    auVar248._28_4_ = 0;
    local_3e8._0_4_ = fStack_140 * auVar12._0_4_ * 3.0;
    local_3e8._4_4_ = fStack_140 * auVar12._4_4_ * 3.0;
    fStack_3e0 = fStack_140 * auVar12._8_4_ * 3.0;
    fStack_3dc = fStack_140 * auVar12._12_4_ * 3.0;
    fStack_3d8 = fStack_140 * auVar12._16_4_ * 3.0;
    fStack_3d4 = fStack_140 * auVar12._20_4_ * 3.0;
    fStack_3d0 = fStack_140 * auVar12._24_4_ * 3.0;
    fStack_3cc = fVar55;
    fVar82 = auVar124._0_4_;
    fVar170 = auVar124._4_4_;
    auVar18._4_4_ = fVar170 * fVar80;
    auVar18._0_4_ = fVar82 * fVar56;
    auVar18._8_4_ = fVar82 * fVar81;
    auVar18._12_4_ = fVar170 * fVar115;
    auVar18._16_4_ = fVar82 * 0.0;
    auVar18._20_4_ = fVar170 * 0.0;
    auVar18._24_4_ = fVar82 * 0.0;
    auVar18._28_4_ = fVar55;
    auVar124 = vfmadd231ps_fma(auVar18,auVar76,local_548);
    fVar82 = auVar121._0_4_;
    auVar19._4_4_ = fVar79 * fVar80;
    auVar19._0_4_ = fVar82 * fVar56;
    auVar19._8_4_ = fVar82 * fVar81;
    auVar19._12_4_ = fVar79 * fVar115;
    auVar19._16_4_ = fVar82 * 0.0;
    auVar19._20_4_ = fVar79 * 0.0;
    auVar19._24_4_ = fVar82 * 0.0;
    auVar19._28_4_ = 0;
    auVar121 = vfmadd231ps_fma(auVar19,auVar76,_local_628);
    fVar79 = auVar101._0_4_;
    fVar82 = auVar101._4_4_;
    auVar20._4_4_ = fVar82 * fVar80;
    auVar20._0_4_ = fVar79 * fVar56;
    auVar20._8_4_ = fVar79 * fVar81;
    auVar20._12_4_ = fVar82 * fVar115;
    auVar20._16_4_ = fVar79 * 0.0;
    auVar20._20_4_ = fVar82 * 0.0;
    auVar20._24_4_ = fVar79 * 0.0;
    auVar20._28_4_ = auVar11._28_4_;
    auVar101 = vfmadd231ps_fma(auVar20,auVar76,auVar181);
    fVar79 = auVar85._0_4_;
    fVar217 = auVar85._4_4_;
    auVar21._4_4_ = fVar217 * fVar80;
    auVar21._0_4_ = fVar79 * fVar56;
    auVar21._8_4_ = fVar79 * fVar81;
    auVar21._12_4_ = fVar217 * fVar115;
    auVar21._16_4_ = fVar79 * 0.0;
    auVar21._20_4_ = fVar217 * 0.0;
    auVar21._24_4_ = fVar79 * 0.0;
    auVar21._28_4_ = fVar170;
    auVar85 = vfmadd231ps_fma(auVar21,auVar76,local_4d8);
    local_4d8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar118));
    fVar79 = auVar57._0_4_;
    fVar82 = auVar57._4_4_;
    auVar22._4_4_ = fVar82 * fVar80;
    auVar22._0_4_ = fVar79 * fVar56;
    auVar22._8_4_ = fVar79 * fVar81;
    auVar22._12_4_ = fVar82 * fVar115;
    auVar22._16_4_ = fVar79 * 0.0;
    auVar22._20_4_ = fVar82 * 0.0;
    auVar22._24_4_ = fVar79 * 0.0;
    auVar22._28_4_ = fVar82;
    auVar57 = vfmadd231ps_fma(auVar22,auVar76,auVar166);
    auVar14 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar116));
    fVar79 = auVar86._0_4_;
    fVar82 = auVar86._4_4_;
    auVar23._4_4_ = fVar82 * fVar80;
    auVar23._0_4_ = fVar79 * fVar56;
    auVar23._8_4_ = fVar79 * fVar81;
    auVar23._12_4_ = fVar82 * fVar115;
    auVar23._16_4_ = fVar79 * 0.0;
    auVar23._20_4_ = fVar82 * 0.0;
    auVar23._24_4_ = fVar79 * 0.0;
    auVar23._28_4_ = fVar82;
    auVar86 = vfmadd231ps_fma(auVar23,auVar76,auVar277);
    auVar24._28_4_ = fVar217;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(auVar101._12_4_ * fVar115,
                            CONCAT48(auVar101._8_4_ * fVar81,
                                     CONCAT44(auVar101._4_4_ * fVar80,auVar101._0_4_ * fVar56))));
    auVar124 = vfmadd231ps_fma(auVar24,auVar76,ZEXT1632(auVar124));
    auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar85._12_4_,
                                                  CONCAT48(fVar81 * auVar85._8_4_,
                                                           CONCAT44(fVar80 * auVar85._4_4_,
                                                                    fVar56 * auVar85._0_4_)))),
                               auVar76,ZEXT1632(auVar121));
    auVar104._0_4_ = auVar118._0_4_ + auVar248._0_4_;
    auVar104._4_4_ = auVar118._4_4_ + auVar248._4_4_;
    auVar104._8_4_ = auVar118._8_4_ + auVar248._8_4_;
    auVar104._12_4_ = auVar118._12_4_ + auVar248._12_4_;
    auVar104._16_4_ = auVar248._16_4_ + 0.0;
    auVar104._20_4_ = auVar248._20_4_ + 0.0;
    auVar104._24_4_ = auVar248._24_4_ + 0.0;
    auVar104._28_4_ = 0;
    auVar101 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar57._12_4_ * fVar115,
                                                  CONCAT48(auVar57._8_4_ * fVar81,
                                                           CONCAT44(auVar57._4_4_ * fVar80,
                                                                    auVar57._0_4_ * fVar56)))),
                               auVar76,ZEXT1632(auVar101));
    auVar85 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar86._12_4_ * fVar115,
                                                 CONCAT48(auVar86._8_4_ * fVar81,
                                                          CONCAT44(auVar86._4_4_ * fVar80,
                                                                   auVar86._0_4_ * fVar56)))),
                              auVar76,ZEXT1632(auVar85));
    auVar57 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar115 * auVar101._12_4_,
                                                 CONCAT48(fVar81 * auVar101._8_4_,
                                                          CONCAT44(fVar80 * auVar101._4_4_,
                                                                   fVar56 * auVar101._0_4_)))),
                              auVar76,ZEXT1632(auVar124));
    auVar86 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar85._12_4_ * fVar115,
                                                 CONCAT48(auVar85._8_4_ * fVar81,
                                                          CONCAT44(auVar85._4_4_ * fVar80,
                                                                   auVar85._0_4_ * fVar56)))),
                              ZEXT1632(auVar121),auVar76);
    auVar76 = vsubps_avx(ZEXT1632(auVar101),ZEXT1632(auVar124));
    auVar11 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar121));
    auVar271._0_4_ = fStack_140 * auVar76._0_4_ * 3.0;
    auVar271._4_4_ = fStack_140 * auVar76._4_4_ * 3.0;
    auVar271._8_4_ = fStack_140 * auVar76._8_4_ * 3.0;
    auVar271._12_4_ = fStack_140 * auVar76._12_4_ * 3.0;
    auVar271._16_4_ = fStack_140 * auVar76._16_4_ * 3.0;
    auVar271._20_4_ = fStack_140 * auVar76._20_4_ * 3.0;
    auVar271._24_4_ = fStack_140 * auVar76._24_4_ * 3.0;
    auVar271._28_4_ = 0;
    local_158 = fStack_140 * auVar11._0_4_ * 3.0;
    fStack_154 = fStack_140 * auVar11._4_4_ * 3.0;
    auVar25._4_4_ = fStack_154;
    auVar25._0_4_ = local_158;
    fStack_150 = fStack_140 * auVar11._8_4_ * 3.0;
    auVar25._8_4_ = fStack_150;
    fStack_14c = fStack_140 * auVar11._12_4_ * 3.0;
    auVar25._12_4_ = fStack_14c;
    fStack_148 = fStack_140 * auVar11._16_4_ * 3.0;
    auVar25._16_4_ = fStack_148;
    fStack_144 = fStack_140 * auVar11._20_4_ * 3.0;
    auVar25._20_4_ = fStack_144;
    fStack_140 = fStack_140 * auVar11._24_4_ * 3.0;
    auVar25._24_4_ = fStack_140;
    auVar25._28_4_ = 0x40400000;
    _local_4f8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar57));
    _local_3b8 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar86));
    auVar76 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar118));
    auVar11 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar116));
    auVar12 = vsubps_avx(_local_4f8,local_4d8);
    fVar252 = auVar76._0_4_ + auVar12._0_4_;
    fVar253 = auVar76._4_4_ + auVar12._4_4_;
    fVar183 = auVar76._8_4_ + auVar12._8_4_;
    fVar184 = auVar76._12_4_ + auVar12._12_4_;
    fVar185 = auVar76._16_4_ + auVar12._16_4_;
    fVar186 = auVar76._20_4_ + auVar12._20_4_;
    fVar187 = auVar76._24_4_ + auVar12._24_4_;
    auVar13 = vsubps_avx(_local_3b8,auVar14);
    auVar77._0_4_ = auVar11._0_4_ + auVar13._0_4_;
    auVar77._4_4_ = auVar11._4_4_ + auVar13._4_4_;
    auVar77._8_4_ = auVar11._8_4_ + auVar13._8_4_;
    auVar77._12_4_ = auVar11._12_4_ + auVar13._12_4_;
    auVar77._16_4_ = auVar11._16_4_ + auVar13._16_4_;
    auVar77._20_4_ = auVar11._20_4_ + auVar13._20_4_;
    auVar77._24_4_ = auVar11._24_4_ + auVar13._24_4_;
    auVar77._28_4_ = auVar11._28_4_ + auVar13._28_4_;
    local_f8 = ZEXT1632(auVar116);
    fVar56 = auVar116._0_4_;
    local_178 = (float)local_3e8._0_4_ + fVar56;
    fVar80 = auVar116._4_4_;
    fStack_174 = (float)local_3e8._4_4_ + fVar80;
    fVar81 = auVar116._8_4_;
    fStack_170 = fStack_3e0 + fVar81;
    fVar115 = auVar116._12_4_;
    fStack_16c = fStack_3dc + fVar115;
    fStack_168 = fStack_3d8 + 0.0;
    fStack_164 = fStack_3d4 + 0.0;
    fStack_160 = fStack_3d0 + 0.0;
    local_b8 = ZEXT1632(auVar118);
    auVar11 = vsubps_avx(local_b8,auVar248);
    local_d8 = vpermps_avx2(_DAT_01fec480,auVar11);
    auVar11 = vsubps_avx(local_f8,_local_3e8);
    local_198 = vpermps_avx2(_DAT_01fec480,auVar11);
    local_118._0_4_ = auVar57._0_4_ + auVar271._0_4_;
    local_118._4_4_ = auVar57._4_4_ + auVar271._4_4_;
    local_118._8_4_ = auVar57._8_4_ + auVar271._8_4_;
    local_118._12_4_ = auVar57._12_4_ + auVar271._12_4_;
    local_118._16_4_ = auVar271._16_4_ + 0.0;
    local_118._20_4_ = auVar271._20_4_ + 0.0;
    local_118._24_4_ = auVar271._24_4_ + 0.0;
    local_118._28_4_ = 0;
    auVar215 = ZEXT3264(local_118);
    auVar249 = ZEXT1632(auVar57);
    auVar11 = vsubps_avx(auVar249,auVar271);
    _local_3e8 = vpermps_avx2(_DAT_01fec480,auVar11);
    fVar79 = auVar86._0_4_;
    local_158 = fVar79 + local_158;
    fVar82 = auVar86._4_4_;
    fStack_154 = fVar82 + fStack_154;
    fVar170 = auVar86._8_4_;
    fStack_150 = fVar170 + fStack_150;
    fVar217 = auVar86._12_4_;
    fStack_14c = fVar217 + fStack_14c;
    fStack_148 = fStack_148 + 0.0;
    fStack_144 = fStack_144 + 0.0;
    fStack_140 = fStack_140 + 0.0;
    auVar11 = vsubps_avx(ZEXT1632(auVar86),auVar25);
    local_138 = vpermps_avx2(_DAT_01fec480,auVar11);
    auVar26._4_4_ = fVar80 * fVar253;
    auVar26._0_4_ = fVar56 * fVar252;
    auVar26._8_4_ = fVar81 * fVar183;
    auVar26._12_4_ = fVar115 * fVar184;
    auVar26._16_4_ = fVar185 * 0.0;
    auVar26._20_4_ = fVar186 * 0.0;
    auVar26._24_4_ = fVar187 * 0.0;
    auVar26._28_4_ = auVar11._28_4_;
    auVar101 = vfnmadd231ps_fma(auVar26,local_b8,auVar77);
    fStack_15c = fVar55 + 0.0;
    auVar27._4_4_ = fStack_174 * fVar253;
    auVar27._0_4_ = local_178 * fVar252;
    auVar27._8_4_ = fStack_170 * fVar183;
    auVar27._12_4_ = fStack_16c * fVar184;
    auVar27._16_4_ = fStack_168 * fVar185;
    auVar27._20_4_ = fStack_164 * fVar186;
    auVar27._24_4_ = fStack_160 * fVar187;
    auVar27._28_4_ = 0;
    auVar124 = vfnmadd231ps_fma(auVar27,auVar77,auVar104);
    auVar28._4_4_ = local_198._4_4_ * fVar253;
    auVar28._0_4_ = local_198._0_4_ * fVar252;
    auVar28._8_4_ = local_198._8_4_ * fVar183;
    auVar28._12_4_ = local_198._12_4_ * fVar184;
    auVar28._16_4_ = local_198._16_4_ * fVar185;
    auVar28._20_4_ = local_198._20_4_ * fVar186;
    auVar28._24_4_ = local_198._24_4_ * fVar187;
    auVar28._28_4_ = fVar55 + 0.0;
    auVar121 = vfnmadd231ps_fma(auVar28,local_d8,auVar77);
    local_628._0_4_ = auVar14._0_4_;
    local_628._4_4_ = auVar14._4_4_;
    uStack_620._0_4_ = auVar14._8_4_;
    uStack_620._4_4_ = auVar14._12_4_;
    uStack_618._0_4_ = auVar14._16_4_;
    uStack_618._4_4_ = auVar14._20_4_;
    uStack_610._0_4_ = auVar14._24_4_;
    uStack_610._4_4_ = auVar14._28_4_;
    auVar29._4_4_ = (float)local_628._4_4_ * fVar253;
    auVar29._0_4_ = (float)local_628._0_4_ * fVar252;
    auVar29._8_4_ = (float)uStack_620 * fVar183;
    auVar29._12_4_ = uStack_620._4_4_ * fVar184;
    auVar29._16_4_ = (float)uStack_618 * fVar185;
    auVar29._20_4_ = uStack_618._4_4_ * fVar186;
    auVar29._24_4_ = (float)uStack_610 * fVar187;
    auVar29._28_4_ = uStack_610._4_4_;
    auVar85 = vfnmadd231ps_fma(auVar29,local_4d8,auVar77);
    auVar198._0_4_ = fVar79 * fVar252;
    auVar198._4_4_ = fVar82 * fVar253;
    auVar198._8_4_ = fVar170 * fVar183;
    auVar198._12_4_ = fVar217 * fVar184;
    auVar198._16_4_ = fVar185 * 0.0;
    auVar198._20_4_ = fVar186 * 0.0;
    auVar198._24_4_ = fVar187 * 0.0;
    auVar198._28_4_ = 0;
    auVar57 = vfnmadd231ps_fma(auVar198,auVar249,auVar77);
    uStack_13c = 0x40400000;
    auVar30._4_4_ = fStack_154 * fVar253;
    auVar30._0_4_ = local_158 * fVar252;
    auVar30._8_4_ = fStack_150 * fVar183;
    auVar30._12_4_ = fStack_14c * fVar184;
    auVar30._16_4_ = fStack_148 * fVar185;
    auVar30._20_4_ = fStack_144 * fVar186;
    auVar30._24_4_ = fStack_140 * fVar187;
    auVar30._28_4_ = local_4d8._28_4_;
    auVar116 = vfnmadd231ps_fma(auVar30,local_118,auVar77);
    auVar31._4_4_ = local_138._4_4_ * fVar253;
    auVar31._0_4_ = local_138._0_4_ * fVar252;
    auVar31._8_4_ = local_138._8_4_ * fVar183;
    auVar31._12_4_ = local_138._12_4_ * fVar184;
    auVar31._16_4_ = local_138._16_4_ * fVar185;
    auVar31._20_4_ = local_138._20_4_ * fVar186;
    auVar31._24_4_ = local_138._24_4_ * fVar187;
    auVar31._28_4_ = local_138._28_4_;
    auVar236 = vfnmadd231ps_fma(auVar31,_local_3e8,auVar77);
    auVar32._4_4_ = local_3b8._4_4_ * fVar253;
    auVar32._0_4_ = local_3b8._0_4_ * fVar252;
    auVar32._8_4_ = local_3b8._8_4_ * fVar183;
    auVar32._12_4_ = local_3b8._12_4_ * fVar184;
    auVar32._16_4_ = local_3b8._16_4_ * fVar185;
    auVar32._20_4_ = local_3b8._20_4_ * fVar186;
    auVar32._24_4_ = local_3b8._24_4_ * fVar187;
    auVar32._28_4_ = auVar76._28_4_ + auVar12._28_4_;
    auVar84 = vfnmadd231ps_fma(auVar32,_local_4f8,auVar77);
    auVar11 = vminps_avx(ZEXT1632(auVar101),ZEXT1632(auVar124));
    auVar76 = vmaxps_avx(ZEXT1632(auVar101),ZEXT1632(auVar124));
    auVar12 = vminps_avx(ZEXT1632(auVar121),ZEXT1632(auVar85));
    auVar12 = vminps_avx(auVar11,auVar12);
    auVar11 = vmaxps_avx(ZEXT1632(auVar121),ZEXT1632(auVar85));
    auVar76 = vmaxps_avx(auVar76,auVar11);
    auVar13 = vminps_avx(ZEXT1632(auVar57),ZEXT1632(auVar116));
    auVar11 = vmaxps_avx(ZEXT1632(auVar57),ZEXT1632(auVar116));
    auVar7 = vminps_avx(ZEXT1632(auVar236),ZEXT1632(auVar84));
    auVar13 = vminps_avx(auVar13,auVar7);
    auVar13 = vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(ZEXT1632(auVar236),ZEXT1632(auVar84));
    auVar11 = vmaxps_avx(auVar11,auVar12);
    auVar11 = vmaxps_avx(auVar76,auVar11);
    auVar43._4_4_ = fStack_74;
    auVar43._0_4_ = local_78;
    auVar43._8_4_ = fStack_70;
    auVar43._12_4_ = fStack_6c;
    auVar43._16_4_ = fStack_68;
    auVar43._20_4_ = fStack_64;
    auVar43._24_4_ = fStack_60;
    auVar43._28_4_ = fStack_5c;
    auVar76 = vcmpps_avx(auVar13,auVar43,2);
    auVar42._4_4_ = fStack_94;
    auVar42._0_4_ = local_98;
    auVar42._8_4_ = fStack_90;
    auVar42._12_4_ = fStack_8c;
    auVar42._16_4_ = fStack_88;
    auVar42._20_4_ = fStack_84;
    auVar42._24_4_ = fStack_80;
    auVar42._28_4_ = fStack_7c;
    auVar11 = vcmpps_avx(auVar11,auVar42,5);
    auVar76 = vandps_avx(auVar11,auVar76);
    auVar11 = local_1b8 & auVar76;
    if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0x7f,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar11 >> 0xbf,0) != '\0') ||
        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar11[0x1f] < '\0')
    {
      auVar11 = vsubps_avx(local_4d8,local_b8);
      auVar12 = vsubps_avx(_local_4f8,auVar249);
      fVar252 = auVar11._0_4_ + auVar12._0_4_;
      fVar253 = auVar11._4_4_ + auVar12._4_4_;
      fVar183 = auVar11._8_4_ + auVar12._8_4_;
      fVar184 = auVar11._12_4_ + auVar12._12_4_;
      fVar185 = auVar11._16_4_ + auVar12._16_4_;
      fVar186 = auVar11._20_4_ + auVar12._20_4_;
      fVar187 = auVar11._24_4_ + auVar12._24_4_;
      auVar13 = vsubps_avx(auVar14,local_f8);
      auVar7 = vsubps_avx(_local_3b8,ZEXT1632(auVar86));
      auVar105._0_4_ = auVar13._0_4_ + auVar7._0_4_;
      auVar105._4_4_ = auVar13._4_4_ + auVar7._4_4_;
      auVar105._8_4_ = auVar13._8_4_ + auVar7._8_4_;
      auVar105._12_4_ = auVar13._12_4_ + auVar7._12_4_;
      auVar105._16_4_ = auVar13._16_4_ + auVar7._16_4_;
      auVar105._20_4_ = auVar13._20_4_ + auVar7._20_4_;
      auVar105._24_4_ = auVar13._24_4_ + auVar7._24_4_;
      fVar55 = auVar7._28_4_;
      auVar105._28_4_ = auVar13._28_4_ + fVar55;
      auVar33._4_4_ = fVar80 * fVar253;
      auVar33._0_4_ = fVar56 * fVar252;
      auVar33._8_4_ = fVar81 * fVar183;
      auVar33._12_4_ = fVar115 * fVar184;
      auVar33._16_4_ = fVar185 * 0.0;
      auVar33._20_4_ = fVar186 * 0.0;
      auVar33._24_4_ = fVar187 * 0.0;
      auVar33._28_4_ = local_4f8._28_4_;
      auVar57 = vfnmadd231ps_fma(auVar33,auVar105,local_b8);
      auVar34._4_4_ = fVar253 * fStack_174;
      auVar34._0_4_ = fVar252 * local_178;
      auVar34._8_4_ = fVar183 * fStack_170;
      auVar34._12_4_ = fVar184 * fStack_16c;
      auVar34._16_4_ = fVar185 * fStack_168;
      auVar34._20_4_ = fVar186 * fStack_164;
      auVar34._24_4_ = fVar187 * fStack_160;
      auVar34._28_4_ = 0;
      auVar101 = vfnmadd213ps_fma(auVar104,auVar105,auVar34);
      auVar35._4_4_ = fVar253 * local_198._4_4_;
      auVar35._0_4_ = fVar252 * local_198._0_4_;
      auVar35._8_4_ = fVar183 * local_198._8_4_;
      auVar35._12_4_ = fVar184 * local_198._12_4_;
      auVar35._16_4_ = fVar185 * local_198._16_4_;
      auVar35._20_4_ = fVar186 * local_198._20_4_;
      auVar35._24_4_ = fVar187 * local_198._24_4_;
      auVar35._28_4_ = 0;
      auVar124 = vfnmadd213ps_fma(local_d8,auVar105,auVar35);
      auVar36._4_4_ = (float)local_628._4_4_ * fVar253;
      auVar36._0_4_ = (float)local_628._0_4_ * fVar252;
      auVar36._8_4_ = (float)uStack_620 * fVar183;
      auVar36._12_4_ = uStack_620._4_4_ * fVar184;
      auVar36._16_4_ = (float)uStack_618 * fVar185;
      auVar36._20_4_ = uStack_618._4_4_ * fVar186;
      auVar36._24_4_ = (float)uStack_610 * fVar187;
      auVar36._28_4_ = 0;
      auVar86 = vfnmadd231ps_fma(auVar36,auVar105,local_4d8);
      auVar125._0_4_ = fVar79 * fVar252;
      auVar125._4_4_ = fVar82 * fVar253;
      auVar125._8_4_ = fVar170 * fVar183;
      auVar125._12_4_ = fVar217 * fVar184;
      auVar125._16_4_ = fVar185 * 0.0;
      auVar125._20_4_ = fVar186 * 0.0;
      auVar125._24_4_ = fVar187 * 0.0;
      auVar125._28_4_ = 0;
      auVar116 = vfnmadd231ps_fma(auVar125,auVar105,auVar249);
      auVar37._4_4_ = fVar253 * fStack_154;
      auVar37._0_4_ = fVar252 * local_158;
      auVar37._8_4_ = fVar183 * fStack_150;
      auVar37._12_4_ = fVar184 * fStack_14c;
      auVar37._16_4_ = fVar185 * fStack_148;
      auVar37._20_4_ = fVar186 * fStack_144;
      auVar37._24_4_ = fVar187 * fStack_140;
      auVar37._28_4_ = fVar55;
      auVar121 = vfnmadd213ps_fma(local_118,auVar105,auVar37);
      auVar38._4_4_ = fVar253 * local_138._4_4_;
      auVar38._0_4_ = fVar252 * local_138._0_4_;
      auVar38._8_4_ = fVar183 * local_138._8_4_;
      auVar38._12_4_ = fVar184 * local_138._12_4_;
      auVar38._16_4_ = fVar185 * local_138._16_4_;
      auVar38._20_4_ = fVar186 * local_138._20_4_;
      auVar38._24_4_ = fVar187 * local_138._24_4_;
      auVar38._28_4_ = fVar55;
      auVar85 = vfnmadd213ps_fma(_local_3e8,auVar105,auVar38);
      auVar215 = ZEXT1664(auVar85);
      auVar39._4_4_ = fVar253 * local_3b8._4_4_;
      auVar39._0_4_ = fVar252 * local_3b8._0_4_;
      auVar39._8_4_ = fVar183 * local_3b8._8_4_;
      auVar39._12_4_ = fVar184 * local_3b8._12_4_;
      auVar39._16_4_ = fVar185 * local_3b8._16_4_;
      auVar39._20_4_ = fVar186 * local_3b8._20_4_;
      auVar39._24_4_ = fVar187 * local_3b8._24_4_;
      auVar39._28_4_ = auVar11._28_4_ + auVar12._28_4_;
      auVar236 = vfnmadd231ps_fma(auVar39,auVar105,_local_4f8);
      auVar12 = vminps_avx(ZEXT1632(auVar57),ZEXT1632(auVar101));
      auVar11 = vmaxps_avx(ZEXT1632(auVar57),ZEXT1632(auVar101));
      auVar13 = vminps_avx(ZEXT1632(auVar124),ZEXT1632(auVar86));
      auVar13 = vminps_avx(auVar12,auVar13);
      auVar12 = vmaxps_avx(ZEXT1632(auVar124),ZEXT1632(auVar86));
      auVar11 = vmaxps_avx(auVar11,auVar12);
      auVar7 = vminps_avx(ZEXT1632(auVar116),ZEXT1632(auVar121));
      auVar12 = vmaxps_avx(ZEXT1632(auVar116),ZEXT1632(auVar121));
      auVar14 = vminps_avx(ZEXT1632(auVar85),ZEXT1632(auVar236));
      auVar7 = vminps_avx(auVar7,auVar14);
      auVar7 = vminps_avx(auVar13,auVar7);
      auVar13 = vmaxps_avx(ZEXT1632(auVar85),ZEXT1632(auVar236));
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vmaxps_avx(auVar11,auVar12);
      auVar11 = vcmpps_avx(auVar7,auVar43,2);
      auVar12 = vcmpps_avx(auVar12,auVar42,5);
      auVar11 = vandps_avx(auVar12,auVar11);
      auVar76 = vandps_avx(auVar76,local_1b8);
      auVar12 = auVar76 & auVar11;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar76 = vandps_avx(auVar11,auVar76);
        uVar51 = vmovmskps_avx(auVar76);
        if (uVar51 != 0) {
          uVar47 = (ulong)uVar52;
          auStack_3c8[uVar47] = uVar51 & 0xff;
          uVar83 = vmovlps_avx(local_328);
          *(undefined8 *)(&uStack_268 + uVar47 * 2) = uVar83;
          uVar46 = vmovlps_avx(auVar62);
          auStack_58[uVar47] = uVar46;
          uVar52 = uVar52 + 1;
        }
      }
    }
    auVar250 = ZEXT464(0x3f800000);
    if (uVar52 != 0) {
      do {
        uVar47 = (ulong)(uVar52 - 1);
        uVar50 = auStack_3c8[uVar47];
        uVar51 = (&uStack_268)[uVar47 * 2];
        fVar56 = afStack_264[uVar47 * 2];
        iVar15 = 0;
        for (uVar46 = (ulong)uVar50; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
          iVar15 = iVar15 + 1;
        }
        uVar50 = uVar50 - 1 & uVar50;
        if (uVar50 == 0) {
          uVar52 = uVar52 - 1;
        }
        auVar62._8_8_ = 0;
        auVar62._0_8_ = auStack_58[uVar47];
        auStack_3c8[uVar47] = uVar50;
        fVar80 = (float)(iVar15 + 1) * 0.14285715;
        auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar56 * (float)iVar15 * 0.14285715)),
                                   ZEXT416(uVar51),
                                   ZEXT416((uint)(auVar250._0_4_ - (float)iVar15 * 0.14285715)));
        auVar124 = vfmadd231ss_fma(ZEXT416((uint)(fVar56 * fVar80)),ZEXT416(uVar51),
                                   ZEXT416((uint)(auVar250._0_4_ - fVar80)));
        fVar80 = auVar124._0_4_;
        fVar81 = auVar101._0_4_;
        fVar56 = fVar80 - fVar81;
        if (0.16666667 <= fVar56) {
          local_328 = vinsertps_avx(auVar101,auVar124,0x10);
          goto LAB_015fac84;
        }
        auVar121 = vshufps_avx(auVar62,auVar62,0x50);
        auVar92._8_4_ = 0x3f800000;
        auVar92._0_8_ = 0x3f8000003f800000;
        auVar92._12_4_ = 0x3f800000;
        auVar85 = vsubps_avx(auVar92,auVar121);
        fVar115 = auVar121._0_4_;
        auVar132._0_4_ = fVar115 * fVar127;
        fVar79 = auVar121._4_4_;
        auVar132._4_4_ = fVar79 * fVar138;
        fVar55 = auVar121._8_4_;
        auVar132._8_4_ = fVar55 * fVar127;
        fVar82 = auVar121._12_4_;
        auVar132._12_4_ = fVar82 * fVar138;
        auVar143._0_4_ = fVar115 * fVar240;
        auVar143._4_4_ = fVar79 * fVar251;
        auVar143._8_4_ = fVar55 * fVar240;
        auVar143._12_4_ = fVar82 * fVar251;
        auVar163._0_4_ = fVar115 * fVar188;
        auVar163._4_4_ = fVar79 * fVar199;
        auVar163._8_4_ = fVar55 * fVar188;
        auVar163._12_4_ = fVar82 * fVar199;
        auVar64._0_4_ = fVar115 * fVar200;
        auVar64._4_4_ = fVar79 * fVar216;
        auVar64._8_4_ = fVar55 * fVar200;
        auVar64._12_4_ = fVar82 * fVar216;
        auVar121 = vfmadd231ps_fma(auVar132,auVar85,auVar174);
        auVar57 = vfmadd231ps_fma(auVar143,auVar85,auVar222);
        auVar86 = vfmadd231ps_fma(auVar163,auVar85,auVar242);
        auVar85 = vfmadd231ps_fma(auVar64,auVar85,auVar256);
        auVar126._16_16_ = auVar121;
        auVar126._0_16_ = auVar121;
        auVar137._16_16_ = auVar57;
        auVar137._0_16_ = auVar57;
        auVar151._16_16_ = auVar86;
        auVar151._0_16_ = auVar86;
        auVar182._4_4_ = fVar81;
        auVar182._0_4_ = fVar81;
        auVar182._8_4_ = fVar81;
        auVar182._12_4_ = fVar81;
        auVar182._20_4_ = fVar80;
        auVar182._16_4_ = fVar80;
        auVar182._24_4_ = fVar80;
        auVar182._28_4_ = fVar80;
        auVar76 = vsubps_avx(auVar137,auVar126);
        auVar57 = vfmadd213ps_fma(auVar76,auVar182,auVar126);
        auVar76 = vsubps_avx(auVar151,auVar137);
        auVar116 = vfmadd213ps_fma(auVar76,auVar182,auVar137);
        auVar121 = vsubps_avx(auVar85,auVar86);
        auVar78._16_16_ = auVar121;
        auVar78._0_16_ = auVar121;
        auVar121 = vfmadd213ps_fma(auVar78,auVar182,auVar151);
        auVar76 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar57));
        auVar85 = vfmadd213ps_fma(auVar76,auVar182,ZEXT1632(auVar57));
        auVar76 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar116));
        auVar121 = vfmadd213ps_fma(auVar76,auVar182,ZEXT1632(auVar116));
        auVar76 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar85));
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar76,auVar182);
        fVar217 = auVar76._4_4_ * 3.0;
        local_4d8._0_4_ = fVar56;
        fVar115 = fVar56 * 0.33333334;
        auVar175._0_8_ =
             CONCAT44(auVar84._4_4_ + fVar115 * fVar217,
                      auVar84._0_4_ + fVar115 * auVar76._0_4_ * 3.0);
        auVar175._8_4_ = auVar84._8_4_ + fVar115 * auVar76._8_4_ * 3.0;
        auVar175._12_4_ = auVar84._12_4_ + fVar115 * auVar76._12_4_ * 3.0;
        _local_3b8 = vshufpd_avx(auVar84,auVar84,3);
        auVar85 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar121 = vsubps_avx(_local_3b8,auVar84);
        _local_4f8 = auVar85;
        auVar57 = vsubps_avx(auVar85,(undefined1  [16])0x0);
        auVar65._0_4_ = auVar121._0_4_ + auVar57._0_4_;
        auVar65._4_4_ = auVar121._4_4_ + auVar57._4_4_;
        auVar65._8_4_ = auVar121._8_4_ + auVar57._8_4_;
        auVar65._12_4_ = auVar121._12_4_ + auVar57._12_4_;
        auVar121 = vshufps_avx(auVar84,auVar84,0xb1);
        auVar57 = vshufps_avx(auVar175,auVar175,0xb1);
        auVar267._4_4_ = auVar65._0_4_;
        auVar267._0_4_ = auVar65._0_4_;
        auVar267._8_4_ = auVar65._0_4_;
        auVar267._12_4_ = auVar65._0_4_;
        auVar86 = vshufps_avx(auVar65,auVar65,0x55);
        fVar79 = auVar86._0_4_;
        auVar66._0_4_ = fVar79 * auVar121._0_4_;
        fVar55 = auVar86._4_4_;
        auVar66._4_4_ = fVar55 * auVar121._4_4_;
        fVar82 = auVar86._8_4_;
        auVar66._8_4_ = fVar82 * auVar121._8_4_;
        fVar170 = auVar86._12_4_;
        auVar66._12_4_ = fVar170 * auVar121._12_4_;
        auVar144._0_4_ = fVar79 * auVar57._0_4_;
        auVar144._4_4_ = fVar55 * auVar57._4_4_;
        auVar144._8_4_ = fVar82 * auVar57._8_4_;
        auVar144._12_4_ = fVar170 * auVar57._12_4_;
        auVar116 = vfmadd231ps_fma(auVar66,auVar267,auVar84);
        _local_3e8 = auVar175;
        auVar236 = vfmadd231ps_fma(auVar144,auVar267,auVar175);
        auVar57 = vshufps_avx(auVar116,auVar116,0xe8);
        auVar86 = vshufps_avx(auVar236,auVar236,0xe8);
        auVar121 = vcmpps_avx(auVar57,auVar86,1);
        uVar51 = vextractps_avx(auVar121,0);
        auVar128 = auVar236;
        if ((uVar51 & 1) == 0) {
          auVar128 = auVar116;
        }
        auVar117._0_4_ = fVar115 * auVar76._16_4_ * 3.0;
        auVar117._4_4_ = fVar115 * fVar217;
        auVar117._8_4_ = fVar115 * auVar76._24_4_ * 3.0;
        auVar117._12_4_ = fVar115 * auVar215._28_4_;
        auVar171 = vsubps_avx((undefined1  [16])0x0,auVar117);
        auVar118 = vshufps_avx(auVar171,auVar171,0xb1);
        auVar139 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar176._0_4_ = fVar79 * auVar118._0_4_;
        auVar176._4_4_ = fVar55 * auVar118._4_4_;
        auVar176._8_4_ = fVar82 * auVar118._8_4_;
        auVar176._12_4_ = fVar170 * auVar118._12_4_;
        auVar194._0_4_ = auVar139._0_4_ * fVar79;
        auVar194._4_4_ = auVar139._4_4_ * fVar55;
        auVar194._8_4_ = auVar139._8_4_ * fVar82;
        auVar194._12_4_ = auVar139._12_4_ * fVar170;
        auVar189 = vfmadd231ps_fma(auVar176,auVar267,auVar171);
        auVar190 = vfmadd231ps_fma(auVar194,(undefined1  [16])0x0,auVar267);
        auVar139 = vshufps_avx(auVar189,auVar189,0xe8);
        auVar140 = vshufps_avx(auVar190,auVar190,0xe8);
        auVar215 = ZEXT1664(auVar140);
        auVar118 = vcmpps_avx(auVar139,auVar140,1);
        uVar51 = vextractps_avx(auVar118,0);
        auVar201 = auVar190;
        if ((uVar51 & 1) == 0) {
          auVar201 = auVar189;
        }
        auVar128 = vmaxss_avx(auVar201,auVar128);
        auVar57 = vminps_avx(auVar57,auVar86);
        auVar86 = vminps_avx(auVar139,auVar140);
        auVar86 = vminps_avx(auVar57,auVar86);
        auVar121 = vshufps_avx(auVar121,auVar121,0x55);
        auVar121 = vblendps_avx(auVar121,auVar118,2);
        auVar118 = vpslld_avx(auVar121,0x1f);
        auVar121 = vshufpd_avx(auVar236,auVar236,1);
        auVar121 = vinsertps_avx(auVar121,auVar190,0x9c);
        auVar57 = vshufpd_avx(auVar116,auVar116,1);
        auVar57 = vinsertps_avx(auVar57,auVar189,0x9c);
        auVar121 = vblendvps_avx(auVar57,auVar121,auVar118);
        auVar57 = vmovshdup_avx(auVar121);
        auVar121 = vmaxss_avx(auVar57,auVar121);
        fVar82 = auVar86._0_4_;
        auVar57 = vmovshdup_avx(auVar86);
        auVar250 = ZEXT464(0x3f800000);
        fVar55 = auVar121._0_4_;
        fVar115 = auVar57._0_4_;
        fVar79 = auVar128._0_4_;
        if (((fVar82 < 0.0001) && (-0.0001 < fVar55)) || (fVar115 < 0.0001 && -0.0001 < fVar55)) {
LAB_015fb52e:
          auVar116 = vcmpps_avx(auVar86,_DAT_01f7aa10,1);
          auVar236 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar57 = vcmpss_avx(auVar128,ZEXT816(0) << 0x20,1);
          auVar93._8_4_ = 0x3f800000;
          auVar93._0_8_ = 0x3f8000003f800000;
          auVar93._12_4_ = 0x3f800000;
          auVar109._8_4_ = 0xbf800000;
          auVar109._0_8_ = 0xbf800000bf800000;
          auVar109._12_4_ = 0xbf800000;
          auVar57 = vblendvps_avx(auVar93,auVar109,auVar57);
          auVar116 = vblendvps_avx(auVar93,auVar109,auVar116);
          fVar217 = auVar116._0_4_;
          fVar170 = auVar57._0_4_;
          auVar57 = SUB6416(ZEXT864(0),0);
          if ((fVar217 == fVar170) && (!NAN(fVar217) && !NAN(fVar170))) {
            auVar57 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar217 == fVar170) && (!NAN(fVar217) && !NAN(fVar170))) {
            auVar236 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar116 = vmovshdup_avx(auVar116);
          fVar252 = auVar116._0_4_;
          if ((fVar217 != fVar252) || (NAN(fVar217) || NAN(fVar252))) {
            if ((fVar115 != fVar82) || (NAN(fVar115) || NAN(fVar82))) {
              auVar119._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
              auVar119._8_4_ = auVar86._8_4_ ^ 0x80000000;
              auVar119._12_4_ = auVar86._12_4_ ^ 0x80000000;
              auVar120._0_4_ = -fVar82 / (fVar115 - fVar82);
              auVar120._4_12_ = auVar119._4_12_;
              auVar86 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar120._0_4_)),auVar120,ZEXT416(0));
              auVar116 = auVar86;
            }
            else {
              auVar86 = ZEXT816(0) << 0x20;
              if ((fVar82 != 0.0) || (auVar116 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar82))) {
                auVar86 = SUB6416(ZEXT464(0x7f800000),0);
                auVar116 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar57 = vminss_avx(auVar57,auVar86);
            auVar236 = vmaxss_avx(auVar116,auVar236);
          }
          auVar121 = vcmpss_avx(auVar121,ZEXT416(0),1);
          auVar94._8_4_ = 0x3f800000;
          auVar94._0_8_ = 0x3f8000003f800000;
          auVar94._12_4_ = 0x3f800000;
          auVar110._8_4_ = 0xbf800000;
          auVar110._0_8_ = 0xbf800000bf800000;
          auVar110._12_4_ = 0xbf800000;
          auVar121 = vblendvps_avx(auVar94,auVar110,auVar121);
          fVar115 = auVar121._0_4_;
          if ((fVar170 != fVar115) || (NAN(fVar170) || NAN(fVar115))) {
            if ((fVar55 != fVar79) || (NAN(fVar55) || NAN(fVar79))) {
              auVar67._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
              auVar67._8_4_ = auVar128._8_4_ ^ 0x80000000;
              auVar67._12_4_ = auVar128._12_4_ ^ 0x80000000;
              auVar122._0_4_ = -fVar79 / (fVar55 - fVar79);
              auVar122._4_12_ = auVar67._4_12_;
              auVar121 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar122._0_4_)),auVar122,ZEXT416(0));
              auVar86 = auVar121;
            }
            else {
              auVar121 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar79 != 0.0) || (auVar86 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar79))) {
                auVar121 = SUB6416(ZEXT464(0xff800000),0);
                auVar86 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar57 = vminss_avx(auVar57,auVar86);
            auVar236 = vmaxss_avx(auVar121,auVar236);
          }
          auVar121 = SUB6416(ZEXT464(0x3f800000),0);
          if ((fVar252 != fVar115) || (NAN(fVar252) || NAN(fVar115))) {
            auVar57 = vminss_avx(auVar57,auVar121);
            auVar236 = vmaxss_avx(auVar121,auVar236);
          }
          auVar57 = vmaxss_avx(ZEXT816(0) << 0x40,auVar57);
          auVar86 = vminss_avx(auVar236,auVar121);
          auVar250 = ZEXT1664(auVar121);
          if (auVar57._0_4_ <= auVar86._0_4_) {
            auVar57 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar57._0_4_ + -0.1)));
            auVar121 = vminss_avx(ZEXT416((uint)(auVar86._0_4_ + 0.1)),auVar121);
            auVar133._0_8_ = auVar84._0_8_;
            auVar133._8_8_ = auVar133._0_8_;
            auVar207._8_8_ = auVar175._0_8_;
            auVar207._0_8_ = auVar175._0_8_;
            auVar223._8_8_ = auVar171._0_8_;
            auVar223._0_8_ = auVar171._0_8_;
            auVar86 = vshufpd_avx(auVar175,auVar175,3);
            auVar116 = vshufpd_avx(auVar171,auVar171,3);
            auVar236 = vshufps_avx(auVar57,auVar121,0);
            auVar68._8_4_ = 0x3f800000;
            auVar68._0_8_ = 0x3f8000003f800000;
            auVar68._12_4_ = 0x3f800000;
            auVar84 = vsubps_avx(auVar68,auVar236);
            fVar115 = auVar236._0_4_;
            auVar69._0_4_ = fVar115 * (float)local_3b8._0_4_;
            fVar79 = auVar236._4_4_;
            auVar69._4_4_ = fVar79 * (float)local_3b8._4_4_;
            fVar55 = auVar236._8_4_;
            auVar69._8_4_ = fVar55 * fStack_3b0;
            fVar82 = auVar236._12_4_;
            auVar69._12_4_ = fVar82 * fStack_3ac;
            auVar164._0_4_ = fVar115 * auVar86._0_4_;
            auVar164._4_4_ = fVar79 * auVar86._4_4_;
            auVar164._8_4_ = fVar55 * auVar86._8_4_;
            auVar164._12_4_ = fVar82 * auVar86._12_4_;
            auVar177._0_4_ = fVar115 * auVar116._0_4_;
            auVar177._4_4_ = fVar79 * auVar116._4_4_;
            auVar177._8_4_ = fVar55 * auVar116._8_4_;
            auVar177._12_4_ = fVar82 * auVar116._12_4_;
            local_4f8._0_4_ = auVar85._0_4_;
            local_4f8._4_4_ = auVar85._4_4_;
            fStack_4f0 = auVar85._8_4_;
            fStack_4ec = auVar85._12_4_;
            auVar195._0_4_ = fVar115 * (float)local_4f8._0_4_;
            auVar195._4_4_ = fVar79 * (float)local_4f8._4_4_;
            auVar195._8_4_ = fVar55 * fStack_4f0;
            auVar195._12_4_ = fVar82 * fStack_4ec;
            auVar116 = vfmadd231ps_fma(auVar69,auVar84,auVar133);
            auVar236 = vfmadd231ps_fma(auVar164,auVar84,auVar207);
            auVar128 = vfmadd231ps_fma(auVar177,auVar84,auVar223);
            auVar84 = vfmadd231ps_fma(auVar195,auVar84,ZEXT816(0));
            auVar85 = vmovshdup_avx(auVar62);
            auVar189 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar57._0_4_)),auVar62,
                                       ZEXT416((uint)(1.0 - auVar57._0_4_)));
            auVar190 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ * auVar121._0_4_)),auVar62,
                                       ZEXT416((uint)(1.0 - auVar121._0_4_)));
            fVar115 = 1.0 / fVar56;
            auVar121 = vsubps_avx(auVar236,auVar116);
            auVar208._0_4_ = auVar121._0_4_ * 3.0;
            auVar208._4_4_ = auVar121._4_4_ * 3.0;
            auVar208._8_4_ = auVar121._8_4_ * 3.0;
            auVar208._12_4_ = auVar121._12_4_ * 3.0;
            auVar121 = vsubps_avx(auVar128,auVar236);
            auVar224._0_4_ = auVar121._0_4_ * 3.0;
            auVar224._4_4_ = auVar121._4_4_ * 3.0;
            auVar224._8_4_ = auVar121._8_4_ * 3.0;
            auVar224._12_4_ = auVar121._12_4_ * 3.0;
            auVar121 = vsubps_avx(auVar84,auVar128);
            auVar237._0_4_ = auVar121._0_4_ * 3.0;
            auVar237._4_4_ = auVar121._4_4_ * 3.0;
            auVar237._8_4_ = auVar121._8_4_ * 3.0;
            auVar237._12_4_ = auVar121._12_4_ * 3.0;
            auVar85 = vminps_avx(auVar224,auVar237);
            auVar121 = vmaxps_avx(auVar224,auVar237);
            auVar85 = vminps_avx(auVar208,auVar85);
            auVar121 = vmaxps_avx(auVar208,auVar121);
            auVar57 = vshufpd_avx(auVar85,auVar85,3);
            auVar86 = vshufpd_avx(auVar121,auVar121,3);
            auVar85 = vminps_avx(auVar85,auVar57);
            auVar121 = vmaxps_avx(auVar121,auVar86);
            auVar225._0_4_ = auVar85._0_4_ * fVar115;
            auVar225._4_4_ = auVar85._4_4_ * fVar115;
            auVar225._8_4_ = auVar85._8_4_ * fVar115;
            auVar225._12_4_ = auVar85._12_4_ * fVar115;
            auVar209._0_4_ = auVar121._0_4_ * fVar115;
            auVar209._4_4_ = auVar121._4_4_ * fVar115;
            auVar209._8_4_ = auVar121._8_4_ * fVar115;
            auVar209._12_4_ = auVar121._12_4_ * fVar115;
            fVar115 = 1.0 / (auVar190._0_4_ - auVar189._0_4_);
            auVar121 = vshufpd_avx(auVar116,auVar116,3);
            auVar85 = vshufpd_avx(auVar236,auVar236,3);
            auVar57 = vshufpd_avx(auVar128,auVar128,3);
            auVar86 = vshufpd_avx(auVar84,auVar84,3);
            auVar121 = vsubps_avx(auVar121,auVar116);
            auVar116 = vsubps_avx(auVar85,auVar236);
            auVar236 = vsubps_avx(auVar57,auVar128);
            auVar86 = vsubps_avx(auVar86,auVar84);
            auVar85 = vminps_avx(auVar121,auVar116);
            auVar121 = vmaxps_avx(auVar121,auVar116);
            auVar57 = vminps_avx(auVar236,auVar86);
            auVar57 = vminps_avx(auVar85,auVar57);
            auVar85 = vmaxps_avx(auVar236,auVar86);
            auVar121 = vmaxps_avx(auVar121,auVar85);
            auVar257._0_4_ = fVar115 * auVar57._0_4_;
            auVar257._4_4_ = fVar115 * auVar57._4_4_;
            auVar257._8_4_ = fVar115 * auVar57._8_4_;
            auVar257._12_4_ = fVar115 * auVar57._12_4_;
            auVar243._0_4_ = fVar115 * auVar121._0_4_;
            auVar243._4_4_ = fVar115 * auVar121._4_4_;
            auVar243._8_4_ = fVar115 * auVar121._8_4_;
            auVar243._12_4_ = fVar115 * auVar121._12_4_;
            auVar86 = vinsertps_avx(auVar101,auVar189,0x10);
            auVar116 = vinsertps_avx(auVar124,auVar190,0x10);
            auVar238._0_4_ = (auVar86._0_4_ + auVar116._0_4_) * 0.5;
            auVar238._4_4_ = (auVar86._4_4_ + auVar116._4_4_) * 0.5;
            auVar238._8_4_ = (auVar86._8_4_ + auVar116._8_4_) * 0.5;
            auVar238._12_4_ = (auVar86._12_4_ + auVar116._12_4_) * 0.5;
            auVar70._4_4_ = auVar238._0_4_;
            auVar70._0_4_ = auVar238._0_4_;
            auVar70._8_4_ = auVar238._0_4_;
            auVar70._12_4_ = auVar238._0_4_;
            auVar121 = vfmadd213ps_fma(local_298,auVar70,auVar8);
            auVar85 = vfmadd213ps_fma(local_2a8,auVar70,auVar9);
            auVar57 = vfmadd213ps_fma(local_2b8,auVar70,auVar10);
            auVar124 = vsubps_avx(auVar85,auVar121);
            auVar121 = vfmadd213ps_fma(auVar124,auVar70,auVar121);
            auVar124 = vsubps_avx(auVar57,auVar85);
            auVar124 = vfmadd213ps_fma(auVar124,auVar70,auVar85);
            auVar124 = vsubps_avx(auVar124,auVar121);
            auVar121 = vfmadd231ps_fma(auVar121,auVar124,auVar70);
            auVar71._0_8_ = CONCAT44(auVar124._4_4_ * 3.0,auVar124._0_4_ * 3.0);
            auVar71._8_4_ = auVar124._8_4_ * 3.0;
            auVar71._12_4_ = auVar124._12_4_ * 3.0;
            auVar268._8_8_ = auVar121._0_8_;
            auVar268._0_8_ = auVar121._0_8_;
            auVar124 = vshufpd_avx(auVar121,auVar121,3);
            auVar121 = vshufps_avx(auVar238,auVar238,0x55);
            auVar84 = vsubps_avx(auVar124,auVar268);
            auVar118 = vfmadd231ps_fma(auVar268,auVar121,auVar84);
            auVar274._8_8_ = auVar71._0_8_;
            auVar274._0_8_ = auVar71._0_8_;
            auVar124 = vshufpd_avx(auVar71,auVar71,3);
            auVar124 = vsubps_avx(auVar124,auVar274);
            auVar128 = vfmadd213ps_fma(auVar124,auVar121,auVar274);
            auVar121 = vmovshdup_avx(auVar128);
            auVar275._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
            auVar275._8_4_ = auVar121._8_4_ ^ 0x80000000;
            auVar275._12_4_ = auVar121._12_4_ ^ 0x80000000;
            auVar85 = vmovshdup_avx(auVar84);
            auVar124 = vunpcklps_avx(auVar85,auVar275);
            auVar57 = vshufps_avx(auVar124,auVar275,4);
            auVar236 = vshufps_avx(auVar238,auVar238,0x54);
            auVar123._0_8_ = auVar84._0_8_ ^ 0x8000000080000000;
            auVar123._8_4_ = auVar84._8_4_ ^ 0x80000000;
            auVar123._12_4_ = auVar84._12_4_ ^ 0x80000000;
            auVar124 = vmovlhps_avx(auVar123,auVar128);
            auVar124 = vshufps_avx(auVar124,auVar128,8);
            auVar121 = vfmsub231ss_fma(ZEXT416((uint)(auVar84._0_4_ * auVar121._0_4_)),auVar85,
                                       auVar128);
            uVar54 = auVar121._0_4_;
            auVar72._4_4_ = uVar54;
            auVar72._0_4_ = uVar54;
            auVar72._8_4_ = uVar54;
            auVar72._12_4_ = uVar54;
            auVar121 = vdivps_avx(auVar57,auVar72);
            auVar85 = vdivps_avx(auVar124,auVar72);
            fVar55 = auVar118._0_4_;
            fVar115 = auVar121._0_4_;
            auVar124 = vshufps_avx(auVar118,auVar118,0x55);
            fVar79 = auVar85._0_4_;
            auVar73._0_4_ = fVar55 * fVar115 + auVar124._0_4_ * fVar79;
            auVar73._4_4_ = fVar55 * auVar121._4_4_ + auVar124._4_4_ * auVar85._4_4_;
            auVar73._8_4_ = fVar55 * auVar121._8_4_ + auVar124._8_4_ * auVar85._8_4_;
            auVar73._12_4_ = fVar55 * auVar121._12_4_ + auVar124._12_4_ * auVar85._12_4_;
            auVar171 = vsubps_avx(auVar236,auVar73);
            auVar236 = vmovshdup_avx(auVar121);
            auVar124 = vinsertps_avx(auVar225,auVar257,0x1c);
            auVar145._0_4_ = auVar236._0_4_ * auVar124._0_4_;
            auVar145._4_4_ = auVar236._4_4_ * auVar124._4_4_;
            auVar145._8_4_ = auVar236._8_4_ * auVar124._8_4_;
            auVar145._12_4_ = auVar236._12_4_ * auVar124._12_4_;
            auVar57 = vinsertps_avx(auVar209,auVar243,0x1c);
            auVar95._0_4_ = auVar57._0_4_ * auVar236._0_4_;
            auVar95._4_4_ = auVar57._4_4_ * auVar236._4_4_;
            auVar95._8_4_ = auVar57._8_4_ * auVar236._8_4_;
            auVar95._12_4_ = auVar57._12_4_ * auVar236._12_4_;
            auVar118 = vminps_avx(auVar145,auVar95);
            auVar128 = vmaxps_avx(auVar95,auVar145);
            auVar236 = vinsertps_avx(auVar257,auVar225,0x4c);
            auVar139 = vmovshdup_avx(auVar85);
            auVar84 = vinsertps_avx(auVar243,auVar209,0x4c);
            auVar244._0_4_ = auVar139._0_4_ * auVar236._0_4_;
            auVar244._4_4_ = auVar139._4_4_ * auVar236._4_4_;
            auVar244._8_4_ = auVar139._8_4_ * auVar236._8_4_;
            auVar244._12_4_ = auVar139._12_4_ * auVar236._12_4_;
            auVar226._0_4_ = auVar139._0_4_ * auVar84._0_4_;
            auVar226._4_4_ = auVar139._4_4_ * auVar84._4_4_;
            auVar226._8_4_ = auVar139._8_4_ * auVar84._8_4_;
            auVar226._12_4_ = auVar139._12_4_ * auVar84._12_4_;
            auVar139 = vminps_avx(auVar244,auVar226);
            auVar258._0_4_ = auVar118._0_4_ + auVar139._0_4_;
            auVar258._4_4_ = auVar118._4_4_ + auVar139._4_4_;
            auVar258._8_4_ = auVar118._8_4_ + auVar139._8_4_;
            auVar258._12_4_ = auVar118._12_4_ + auVar139._12_4_;
            auVar118 = vmaxps_avx(auVar226,auVar244);
            auVar96._0_4_ = auVar118._0_4_ + auVar128._0_4_;
            auVar96._4_4_ = auVar118._4_4_ + auVar128._4_4_;
            auVar96._8_4_ = auVar118._8_4_ + auVar128._8_4_;
            auVar96._12_4_ = auVar118._12_4_ + auVar128._12_4_;
            auVar227._8_8_ = 0x3f80000000000000;
            auVar227._0_8_ = 0x3f80000000000000;
            auVar128 = vsubps_avx(auVar227,auVar96);
            auVar118 = vsubps_avx(auVar227,auVar258);
            auVar139 = vsubps_avx(auVar86,auVar238);
            auVar140 = vsubps_avx(auVar116,auVar238);
            auVar111._0_4_ = fVar115 * auVar124._0_4_;
            auVar111._4_4_ = fVar115 * auVar124._4_4_;
            auVar111._8_4_ = fVar115 * auVar124._8_4_;
            auVar111._12_4_ = fVar115 * auVar124._12_4_;
            auVar259._0_4_ = fVar115 * auVar57._0_4_;
            auVar259._4_4_ = fVar115 * auVar57._4_4_;
            auVar259._8_4_ = fVar115 * auVar57._8_4_;
            auVar259._12_4_ = fVar115 * auVar57._12_4_;
            auVar57 = vminps_avx(auVar111,auVar259);
            auVar124 = vmaxps_avx(auVar259,auVar111);
            auVar146._0_4_ = fVar79 * auVar236._0_4_;
            auVar146._4_4_ = fVar79 * auVar236._4_4_;
            auVar146._8_4_ = fVar79 * auVar236._8_4_;
            auVar146._12_4_ = fVar79 * auVar236._12_4_;
            auVar210._0_4_ = fVar79 * auVar84._0_4_;
            auVar210._4_4_ = fVar79 * auVar84._4_4_;
            auVar210._8_4_ = fVar79 * auVar84._8_4_;
            auVar210._12_4_ = fVar79 * auVar84._12_4_;
            auVar236 = vminps_avx(auVar146,auVar210);
            auVar260._0_4_ = auVar57._0_4_ + auVar236._0_4_;
            auVar260._4_4_ = auVar57._4_4_ + auVar236._4_4_;
            auVar260._8_4_ = auVar57._8_4_ + auVar236._8_4_;
            auVar260._12_4_ = auVar57._12_4_ + auVar236._12_4_;
            fVar252 = auVar139._0_4_;
            auVar269._0_4_ = fVar252 * auVar128._0_4_;
            fVar253 = auVar139._4_4_;
            auVar269._4_4_ = fVar253 * auVar128._4_4_;
            fVar183 = auVar139._8_4_;
            auVar269._8_4_ = fVar183 * auVar128._8_4_;
            fVar184 = auVar139._12_4_;
            auVar269._12_4_ = fVar184 * auVar128._12_4_;
            auVar57 = vmaxps_avx(auVar210,auVar146);
            auVar211._0_4_ = fVar252 * auVar118._0_4_;
            auVar211._4_4_ = fVar253 * auVar118._4_4_;
            auVar211._8_4_ = fVar183 * auVar118._8_4_;
            auVar211._12_4_ = fVar184 * auVar118._12_4_;
            fVar55 = auVar140._0_4_;
            auVar97._0_4_ = fVar55 * auVar128._0_4_;
            fVar82 = auVar140._4_4_;
            auVar97._4_4_ = fVar82 * auVar128._4_4_;
            fVar170 = auVar140._8_4_;
            auVar97._8_4_ = fVar170 * auVar128._8_4_;
            fVar217 = auVar140._12_4_;
            auVar97._12_4_ = fVar217 * auVar128._12_4_;
            auVar228._0_4_ = fVar55 * auVar118._0_4_;
            auVar228._4_4_ = fVar82 * auVar118._4_4_;
            auVar228._8_4_ = fVar170 * auVar118._8_4_;
            auVar228._12_4_ = fVar217 * auVar118._12_4_;
            auVar112._0_4_ = auVar124._0_4_ + auVar57._0_4_;
            auVar112._4_4_ = auVar124._4_4_ + auVar57._4_4_;
            auVar112._8_4_ = auVar124._8_4_ + auVar57._8_4_;
            auVar112._12_4_ = auVar124._12_4_ + auVar57._12_4_;
            auVar147._8_8_ = 0x3f800000;
            auVar147._0_8_ = 0x3f800000;
            auVar124 = vsubps_avx(auVar147,auVar112);
            auVar57 = vsubps_avx(auVar147,auVar260);
            auVar261._0_4_ = fVar252 * auVar124._0_4_;
            auVar261._4_4_ = fVar253 * auVar124._4_4_;
            auVar261._8_4_ = fVar183 * auVar124._8_4_;
            auVar261._12_4_ = fVar184 * auVar124._12_4_;
            auVar245._0_4_ = fVar252 * auVar57._0_4_;
            auVar245._4_4_ = fVar253 * auVar57._4_4_;
            auVar245._8_4_ = fVar183 * auVar57._8_4_;
            auVar245._12_4_ = fVar184 * auVar57._12_4_;
            auVar113._0_4_ = fVar55 * auVar124._0_4_;
            auVar113._4_4_ = fVar82 * auVar124._4_4_;
            auVar113._8_4_ = fVar170 * auVar124._8_4_;
            auVar113._12_4_ = fVar217 * auVar124._12_4_;
            auVar148._0_4_ = fVar55 * auVar57._0_4_;
            auVar148._4_4_ = fVar82 * auVar57._4_4_;
            auVar148._8_4_ = fVar170 * auVar57._8_4_;
            auVar148._12_4_ = fVar217 * auVar57._12_4_;
            auVar124 = vminps_avx(auVar261,auVar245);
            auVar57 = vminps_avx(auVar113,auVar148);
            auVar124 = vminps_avx(auVar124,auVar57);
            auVar57 = vmaxps_avx(auVar245,auVar261);
            auVar236 = vmaxps_avx(auVar148,auVar113);
            auVar84 = vminps_avx(auVar269,auVar211);
            auVar128 = vminps_avx(auVar97,auVar228);
            auVar84 = vminps_avx(auVar84,auVar128);
            auVar124 = vhaddps_avx(auVar124,auVar84);
            auVar57 = vmaxps_avx(auVar236,auVar57);
            auVar250 = ZEXT464(0x3f800000);
            auVar236 = vmaxps_avx(auVar211,auVar269);
            auVar84 = vmaxps_avx(auVar228,auVar97);
            auVar236 = vmaxps_avx(auVar84,auVar236);
            auVar57 = vhaddps_avx(auVar57,auVar236);
            auVar124 = vshufps_avx(auVar124,auVar124,0xe8);
            auVar57 = vshufps_avx(auVar57,auVar57,0xe8);
            auVar229._0_4_ = auVar171._0_4_ + auVar124._0_4_;
            auVar229._4_4_ = auVar171._4_4_ + auVar124._4_4_;
            auVar229._8_4_ = auVar171._8_4_ + auVar124._8_4_;
            auVar229._12_4_ = auVar171._12_4_ + auVar124._12_4_;
            auVar212._0_4_ = auVar171._0_4_ + auVar57._0_4_;
            auVar212._4_4_ = auVar171._4_4_ + auVar57._4_4_;
            auVar212._8_4_ = auVar171._8_4_ + auVar57._8_4_;
            auVar212._12_4_ = auVar171._12_4_ + auVar57._12_4_;
            auVar215 = ZEXT1664(auVar212);
            auVar124 = vmaxps_avx(auVar86,auVar229);
            auVar57 = vminps_avx(auVar212,auVar116);
            auVar124 = vcmpps_avx(auVar57,auVar124,1);
            auVar124 = vshufps_avx(auVar124,auVar124,0x50);
            if ((auVar124 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar124[0xf]) {
              bVar49 = 0;
              if ((fVar81 < auVar229._0_4_) && (auVar212._0_4_ < auVar116._0_4_)) {
                auVar57 = vmovshdup_avx(auVar229);
                auVar124 = vcmpps_avx(auVar212,auVar116,1);
                bVar49 = auVar124[4] & auVar189._0_4_ < auVar57._0_4_;
              }
              if (((3 < uVar52 || fVar56 < 0.001) | bVar49) != 1) goto LAB_015fc1b6;
              lVar48 = 200;
              do {
                fVar55 = auVar171._0_4_;
                fVar81 = 1.0 - fVar55;
                fVar56 = fVar81 * fVar81 * fVar81;
                fVar80 = fVar55 * 3.0 * fVar81 * fVar81;
                fVar81 = fVar81 * fVar55 * fVar55 * 3.0;
                auVar134._4_4_ = fVar56;
                auVar134._0_4_ = fVar56;
                auVar134._8_4_ = fVar56;
                auVar134._12_4_ = fVar56;
                auVar114._4_4_ = fVar80;
                auVar114._0_4_ = fVar80;
                auVar114._8_4_ = fVar80;
                auVar114._12_4_ = fVar80;
                auVar98._4_4_ = fVar81;
                auVar98._0_4_ = fVar81;
                auVar98._8_4_ = fVar81;
                auVar98._12_4_ = fVar81;
                fVar55 = fVar55 * fVar55 * fVar55;
                auVar149._0_4_ = fVar55 * (float)local_278._0_4_;
                auVar149._4_4_ = fVar55 * (float)local_278._4_4_;
                auVar149._8_4_ = fVar55 * fStack_270;
                auVar149._12_4_ = fVar55 * fStack_26c;
                auVar101 = vfmadd231ps_fma(auVar149,auVar98,auVar10);
                auVar101 = vfmadd231ps_fma(auVar101,auVar114,auVar9);
                auVar101 = vfmadd231ps_fma(auVar101,auVar134,auVar8);
                auVar99._8_8_ = auVar101._0_8_;
                auVar99._0_8_ = auVar101._0_8_;
                auVar101 = vshufpd_avx(auVar101,auVar101,3);
                auVar124 = vshufps_avx(auVar171,auVar171,0x55);
                auVar101 = vsubps_avx(auVar101,auVar99);
                auVar124 = vfmadd213ps_fma(auVar101,auVar124,auVar99);
                fVar56 = auVar124._0_4_;
                auVar101 = vshufps_avx(auVar124,auVar124,0x55);
                auVar100._0_4_ = fVar115 * fVar56 + fVar79 * auVar101._0_4_;
                auVar100._4_4_ = auVar121._4_4_ * fVar56 + auVar85._4_4_ * auVar101._4_4_;
                auVar100._8_4_ = auVar121._8_4_ * fVar56 + auVar85._8_4_ * auVar101._8_4_;
                auVar100._12_4_ = auVar121._12_4_ * fVar56 + auVar85._12_4_ * auVar101._12_4_;
                auVar171 = vsubps_avx(auVar171,auVar100);
                auVar101 = vandps_avx(local_3f8,auVar124);
                auVar124 = vshufps_avx(auVar101,auVar101,0xf5);
                auVar101 = vmaxss_avx(auVar124,auVar101);
                if (auVar101._0_4_ < (float)local_288._0_4_) {
                  fVar56 = auVar171._0_4_;
                  if ((0.0 <= fVar56) && (fVar56 <= 1.0)) {
                    auVar101 = vmovshdup_avx(auVar171);
                    fVar80 = auVar101._0_4_;
                    if ((0.0 <= fVar80) && (fVar80 <= 1.0)) {
                      auVar101 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                               0x1c);
                      auVar236 = vinsertps_avx(auVar101,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                      auVar101 = vdpps_avx(auVar236,local_408,0x7f);
                      auVar124 = vdpps_avx(auVar236,local_418,0x7f);
                      auVar121 = vdpps_avx(auVar236,local_2c8,0x7f);
                      auVar85 = vdpps_avx(auVar236,local_2d8,0x7f);
                      auVar57 = vdpps_avx(auVar236,local_2e8,0x7f);
                      auVar86 = vdpps_avx(auVar236,local_2f8,0x7f);
                      auVar116 = vdpps_avx(auVar236,local_308,0x7f);
                      auVar236 = vdpps_avx(auVar236,local_318,0x7f);
                      fVar81 = 1.0 - fVar80;
                      auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar80 * auVar57._0_4_)),
                                                 ZEXT416((uint)fVar81),auVar101);
                      auVar124 = vfmadd231ss_fma(ZEXT416((uint)(auVar86._0_4_ * fVar80)),
                                                 ZEXT416((uint)fVar81),auVar124);
                      auVar121 = vfmadd231ss_fma(ZEXT416((uint)(auVar116._0_4_ * fVar80)),
                                                 ZEXT416((uint)fVar81),auVar121);
                      auVar215 = ZEXT1664(auVar121);
                      auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar80 * auVar236._0_4_)),
                                                ZEXT416((uint)fVar81),auVar85);
                      fVar55 = 1.0 - fVar56;
                      fVar81 = fVar55 * fVar56 * fVar56 * 3.0;
                      fVar170 = fVar56 * fVar56 * fVar56;
                      auVar121 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * auVar85._0_4_)),
                                                 ZEXT416((uint)fVar81),auVar121);
                      fVar115 = fVar56 * 3.0 * fVar55 * fVar55;
                      auVar124 = vfmadd231ss_fma(auVar121,ZEXT416((uint)fVar115),auVar124);
                      fVar79 = fVar55 * fVar55 * fVar55;
                      auVar101 = vfmadd231ss_fma(auVar124,ZEXT416((uint)fVar79),auVar101);
                      fVar82 = auVar101._0_4_;
                      if (((fVar53 <= fVar82) &&
                          (fVar217 = *(float *)(ray + k * 4 + 0x80), fVar82 <= fVar217)) &&
                         (pGVar3 = (context->scene->geometries).items[uVar45].ptr,
                         (pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                        auVar101 = vshufps_avx(auVar171,auVar171,0x55);
                        auVar213._8_4_ = 0x3f800000;
                        auVar213._0_8_ = 0x3f8000003f800000;
                        auVar213._12_4_ = 0x3f800000;
                        auVar124 = vsubps_avx(auVar213,auVar101);
                        fVar252 = auVar101._0_4_;
                        auVar230._0_4_ = fVar252 * (float)local_438._0_4_;
                        fVar253 = auVar101._4_4_;
                        auVar230._4_4_ = fVar253 * (float)local_438._4_4_;
                        fVar183 = auVar101._8_4_;
                        auVar230._8_4_ = fVar183 * fStack_430;
                        fVar184 = auVar101._12_4_;
                        auVar230._12_4_ = fVar184 * fStack_42c;
                        auVar239._0_4_ = fVar252 * (float)local_478._0_4_;
                        auVar239._4_4_ = fVar253 * (float)local_478._4_4_;
                        auVar239._8_4_ = fVar183 * fStack_470;
                        auVar239._12_4_ = fVar184 * fStack_46c;
                        auVar246._0_4_ = fVar252 * (float)local_488._0_4_;
                        auVar246._4_4_ = fVar253 * (float)local_488._4_4_;
                        auVar246._8_4_ = fVar183 * fStack_480;
                        auVar246._12_4_ = fVar184 * fStack_47c;
                        auVar262._0_4_ = fVar252 * fVar152;
                        auVar262._4_4_ = fVar253 * fVar167;
                        auVar262._8_4_ = fVar183 * fVar168;
                        auVar262._12_4_ = fVar184 * fVar169;
                        auVar121 = vfmadd231ps_fma(auVar230,auVar124,local_428);
                        auVar85 = vfmadd231ps_fma(auVar239,auVar124,local_458);
                        auVar57 = vfmadd231ps_fma(auVar246,auVar124,local_468);
                        auVar86 = vfmadd231ps_fma(auVar262,auVar124,local_448);
                        auVar124 = vsubps_avx(auVar85,auVar121);
                        auVar121 = vsubps_avx(auVar57,auVar85);
                        auVar85 = vsubps_avx(auVar86,auVar57);
                        local_218._4_4_ = fVar56;
                        local_218._0_4_ = fVar56;
                        local_218._8_4_ = fVar56;
                        local_218._12_4_ = fVar56;
                        auVar215 = ZEXT1664(local_218);
                        auVar263._0_4_ = fVar56 * auVar121._0_4_;
                        auVar263._4_4_ = fVar56 * auVar121._4_4_;
                        auVar263._8_4_ = fVar56 * auVar121._8_4_;
                        auVar263._12_4_ = fVar56 * auVar121._12_4_;
                        auVar196._4_4_ = fVar55;
                        auVar196._0_4_ = fVar55;
                        auVar196._8_4_ = fVar55;
                        auVar196._12_4_ = fVar55;
                        auVar124 = vfmadd231ps_fma(auVar263,auVar196,auVar124);
                        auVar231._0_4_ = fVar56 * auVar85._0_4_;
                        auVar231._4_4_ = fVar56 * auVar85._4_4_;
                        auVar231._8_4_ = fVar56 * auVar85._8_4_;
                        auVar231._12_4_ = fVar56 * auVar85._12_4_;
                        auVar121 = vfmadd231ps_fma(auVar231,auVar196,auVar121);
                        auVar232._0_4_ = fVar56 * auVar121._0_4_;
                        auVar232._4_4_ = fVar56 * auVar121._4_4_;
                        auVar232._8_4_ = fVar56 * auVar121._8_4_;
                        auVar232._12_4_ = fVar56 * auVar121._12_4_;
                        auVar121 = vfmadd231ps_fma(auVar232,auVar196,auVar124);
                        auVar178._0_4_ = fVar170 * (float)local_368._0_4_;
                        auVar178._4_4_ = fVar170 * (float)local_368._4_4_;
                        auVar178._8_4_ = fVar170 * fStack_360;
                        auVar178._12_4_ = fVar170 * fStack_35c;
                        auVar135._4_4_ = fVar81;
                        auVar135._0_4_ = fVar81;
                        auVar135._8_4_ = fVar81;
                        auVar135._12_4_ = fVar81;
                        auVar124 = vfmadd132ps_fma(auVar135,auVar178,local_358);
                        auVar165._4_4_ = fVar115;
                        auVar165._0_4_ = fVar115;
                        auVar165._8_4_ = fVar115;
                        auVar165._12_4_ = fVar115;
                        auVar124 = vfmadd132ps_fma(auVar165,auVar124,local_348);
                        auVar179._0_4_ = auVar121._0_4_ * 3.0;
                        auVar179._4_4_ = auVar121._4_4_ * 3.0;
                        auVar179._8_4_ = auVar121._8_4_ * 3.0;
                        auVar179._12_4_ = auVar121._12_4_ * 3.0;
                        auVar150._4_4_ = fVar79;
                        auVar150._0_4_ = fVar79;
                        auVar150._8_4_ = fVar79;
                        auVar150._12_4_ = fVar79;
                        auVar121 = vfmadd132ps_fma(auVar150,auVar124,local_338);
                        auVar124 = vshufps_avx(auVar179,auVar179,0xc9);
                        auVar136._0_4_ = auVar121._0_4_ * auVar124._0_4_;
                        auVar136._4_4_ = auVar121._4_4_ * auVar124._4_4_;
                        auVar136._8_4_ = auVar121._8_4_ * auVar124._8_4_;
                        auVar136._12_4_ = auVar121._12_4_ * auVar124._12_4_;
                        auVar124 = vshufps_avx(auVar121,auVar121,0xc9);
                        auVar124 = vfmsub231ps_fma(auVar136,auVar179,auVar124);
                        local_228 = auVar124._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar82;
                          uVar54 = vextractps_avx(auVar124,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar54;
                          uVar54 = vextractps_avx(auVar124,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar54;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                          *(float *)(ray + k * 4 + 0xf0) = fVar56;
                          *(float *)(ray + k * 4 + 0x100) = fVar80;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_508;
                          *(uint *)(ray + k * 4 + 0x120) = uVar45;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          auVar250 = ZEXT464(0x3f800000);
                        }
                        else {
                          auVar121 = vshufps_avx(auVar124,auVar124,0x55);
                          auVar124 = vshufps_avx(auVar124,auVar124,0xaa);
                          local_248[0] = (RTCHitN)auVar121[0];
                          local_248[1] = (RTCHitN)auVar121[1];
                          local_248[2] = (RTCHitN)auVar121[2];
                          local_248[3] = (RTCHitN)auVar121[3];
                          local_248[4] = (RTCHitN)auVar121[4];
                          local_248[5] = (RTCHitN)auVar121[5];
                          local_248[6] = (RTCHitN)auVar121[6];
                          local_248[7] = (RTCHitN)auVar121[7];
                          local_248[8] = (RTCHitN)auVar121[8];
                          local_248[9] = (RTCHitN)auVar121[9];
                          local_248[10] = (RTCHitN)auVar121[10];
                          local_248[0xb] = (RTCHitN)auVar121[0xb];
                          local_248[0xc] = (RTCHitN)auVar121[0xc];
                          local_248[0xd] = (RTCHitN)auVar121[0xd];
                          local_248[0xe] = (RTCHitN)auVar121[0xe];
                          local_248[0xf] = (RTCHitN)auVar121[0xf];
                          local_238 = auVar124;
                          uStack_224 = local_228;
                          uStack_220 = local_228;
                          uStack_21c = local_228;
                          local_208 = auVar101;
                          local_1f8 = CONCAT44(uStack_394,local_398);
                          uStack_1f0 = CONCAT44(uStack_38c,uStack_390);
                          local_1e8._4_4_ = uStack_384;
                          local_1e8._0_4_ = local_388;
                          local_1e8._8_4_ = uStack_380;
                          local_1e8._12_4_ = uStack_37c;
                          vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                          uStack_1d4 = context->user->instID[0];
                          local_1d8 = uStack_1d4;
                          uStack_1d0 = uStack_1d4;
                          uStack_1cc = uStack_1d4;
                          uStack_1c8 = context->user->instPrimID[0];
                          uStack_1c4 = uStack_1c8;
                          uStack_1c0 = uStack_1c8;
                          uStack_1bc = uStack_1c8;
                          *(float *)(ray + k * 4 + 0x80) = fVar82;
                          local_528 = *local_510;
                          local_4b8.valid = (int *)local_528;
                          local_4b8.geometryUserPtr = pGVar3->userPtr;
                          local_4b8.context = context->user;
                          local_4b8.hit = local_248;
                          local_4b8.N = 4;
                          local_4b8.ray = (RTCRayN *)ray;
                          if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar215 = ZEXT1664(local_218);
                            (*pGVar3->intersectionFilterN)(&local_4b8);
                            auVar250._8_56_ = extraout_var;
                            auVar250._0_8_ = extraout_XMM1_Qa;
                            auVar124 = auVar250._0_16_;
                          }
                          if (local_528 == (undefined1  [16])0x0) {
                            auVar101 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar124 = vpcmpeqd_avx(auVar124,auVar124);
                            auVar101 = auVar101 ^ auVar124;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            auVar124 = vpcmpeqd_avx(auVar101,auVar101);
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar215 = ZEXT1664(auVar215._0_16_);
                              (*p_Var6)(&local_4b8);
                              auVar124 = vpcmpeqd_avx(auVar124,auVar124);
                            }
                            auVar121 = vpcmpeqd_avx(local_528,_DAT_01f7aa10);
                            auVar101 = auVar121 ^ auVar124;
                            if (local_528 != (undefined1  [16])0x0) {
                              auVar121 = auVar121 ^ auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])local_4b8.hit
                                                       );
                              *(undefined1 (*) [16])(local_4b8.ray + 0xc0) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x10));
                              *(undefined1 (*) [16])(local_4b8.ray + 0xd0) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x20));
                              *(undefined1 (*) [16])(local_4b8.ray + 0xe0) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x30));
                              *(undefined1 (*) [16])(local_4b8.ray + 0xf0) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x40));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x100) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x50));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x110) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x60));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x120) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x70));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x130) = auVar124;
                              auVar124 = vmaskmovps_avx(auVar121,*(undefined1 (*) [16])
                                                                  (local_4b8.hit + 0x80));
                              *(undefined1 (*) [16])(local_4b8.ray + 0x140) = auVar124;
                            }
                          }
                          auVar250 = ZEXT464(0x3f800000);
                          auVar74._8_8_ = 0x100000001;
                          auVar74._0_8_ = 0x100000001;
                          if ((auVar74 & auVar101) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar217;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar48 = lVar48 + -1;
              } while (lVar48 != 0);
            }
          }
        }
        else {
          auVar57 = vcmpps_avx(auVar57,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar116 = vcmpps_avx(auVar86,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar57 = vandps_avx(auVar116,auVar57);
          if (-0.0001 < fVar79 && (auVar57 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_015fb52e;
        }
        if (uVar52 == 0) break;
      } while( true );
    }
    uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar75._4_4_ = uVar54;
    auVar75._0_4_ = uVar54;
    auVar75._8_4_ = uVar54;
    auVar75._12_4_ = uVar54;
    auVar101 = vcmpps_avx(local_378,auVar75,2);
    uVar45 = vmovmskps_avx(auVar101);
    uVar44 = uVar44 & (uint)local_500 & uVar45;
    if (uVar44 == 0) {
      return;
    }
  } while( true );
LAB_015fc1b6:
  local_328 = vinsertps_avx(auVar101,ZEXT416((uint)fVar80),0x10);
  auVar62 = vinsertps_avx(auVar189,ZEXT416((uint)auVar190._0_4_),0x10);
  goto LAB_015fac84;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }